

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14PrivateFunctionMapFactory.cpp
# Opt level: O0

ElementFunctionMap *
COLLADASaxFWL14::FunctionMapFactory::createFunctionMap__library_physics_models__allChildren(void)

{
  int iVar1;
  mapped_type *pmVar2;
  ElementValidateEndFunctionPtr in_R9;
  code *pcVar3;
  key_type *in_stack_ffffffffffffb0d8;
  code *__k;
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
  *in_stack_ffffffffffffb0e0;
  code *this;
  FunctionStruct local_4c28;
  code *local_4bc8;
  undefined8 uStack_4bc0;
  code *local_4bb8;
  undefined8 uStack_4bb0;
  code *local_4ba8;
  undefined8 uStack_4ba0;
  code *local_4b98;
  undefined8 uStack_4b90;
  code *local_4b88;
  undefined8 local_4b80;
  code *local_4b78;
  undefined8 local_4b70;
  FunctionStruct local_4b68;
  code *local_4b08;
  undefined8 uStack_4b00;
  code *local_4af8;
  undefined8 uStack_4af0;
  code *local_4ae8;
  undefined8 uStack_4ae0;
  code *local_4ad8;
  undefined8 uStack_4ad0;
  code *local_4ac8;
  undefined8 local_4ac0;
  code *local_4ab8;
  undefined8 local_4ab0;
  FunctionStruct local_4aa8;
  code *local_4a48;
  undefined8 uStack_4a40;
  code *local_4a38;
  undefined8 uStack_4a30;
  code *local_4a28;
  undefined8 uStack_4a20;
  code *local_4a18;
  undefined8 uStack_4a10;
  code *local_4a08;
  undefined8 local_4a00;
  code *local_49f8;
  undefined8 local_49f0;
  FunctionStruct local_49e8;
  code *local_4988;
  undefined8 uStack_4980;
  code *local_4978;
  undefined8 uStack_4970;
  code *local_4968;
  undefined8 uStack_4960;
  code *local_4958;
  undefined8 uStack_4950;
  code *local_4948;
  undefined8 local_4940;
  code *local_4938;
  undefined8 local_4930;
  FunctionStruct local_4928;
  code *local_48c8;
  undefined8 uStack_48c0;
  code *local_48b8;
  undefined8 uStack_48b0;
  code *local_48a8;
  undefined8 uStack_48a0;
  code *local_4898;
  undefined8 uStack_4890;
  code *local_4888;
  undefined8 local_4880;
  code *local_4878;
  undefined8 local_4870;
  FunctionStruct local_4868;
  code *local_4808;
  undefined8 uStack_4800;
  code *local_47f8;
  undefined8 uStack_47f0;
  code *local_47e8;
  undefined8 uStack_47e0;
  code *local_47d8;
  undefined8 uStack_47d0;
  code *local_47c8;
  undefined8 local_47c0;
  code *local_47b8;
  undefined8 local_47b0;
  FunctionStruct local_47a8;
  code *local_4748;
  undefined8 uStack_4740;
  code *local_4738;
  undefined8 uStack_4730;
  code *local_4728;
  undefined8 uStack_4720;
  code *local_4718;
  undefined8 uStack_4710;
  code *local_4708;
  undefined8 local_4700;
  code *local_46f8;
  undefined8 local_46f0;
  FunctionStruct local_46e8;
  code *local_4688;
  undefined8 uStack_4680;
  code *local_4678;
  undefined8 uStack_4670;
  code *local_4668;
  undefined8 uStack_4660;
  code *local_4658;
  undefined8 uStack_4650;
  code *local_4648;
  undefined8 local_4640;
  code *local_4638;
  undefined8 local_4630;
  FunctionStruct local_4628;
  code *local_45c8;
  undefined8 uStack_45c0;
  code *local_45b8;
  undefined8 uStack_45b0;
  code *local_45a8;
  undefined8 uStack_45a0;
  code *local_4598;
  undefined8 uStack_4590;
  code *local_4588;
  undefined8 local_4580;
  code *local_4578;
  undefined8 local_4570;
  FunctionStruct local_4568;
  code *local_4508;
  undefined8 uStack_4500;
  code *local_44f8;
  undefined8 uStack_44f0;
  code *local_44e8;
  undefined8 uStack_44e0;
  code *local_44d8;
  undefined8 uStack_44d0;
  code *local_44c8;
  undefined8 local_44c0;
  code *local_44b8;
  undefined8 local_44b0;
  FunctionStruct local_44a8;
  code *local_4448;
  undefined8 uStack_4440;
  code *local_4438;
  undefined8 uStack_4430;
  code *local_4428;
  undefined8 uStack_4420;
  code *local_4418;
  undefined8 uStack_4410;
  code *local_4408;
  undefined8 local_4400;
  code *local_43f8;
  undefined8 local_43f0;
  FunctionStruct local_43e8;
  code *local_4388;
  undefined8 uStack_4380;
  code *local_4378;
  undefined8 uStack_4370;
  code *local_4368;
  undefined8 uStack_4360;
  code *local_4358;
  undefined8 uStack_4350;
  code *local_4348;
  undefined8 local_4340;
  code *local_4338;
  undefined8 local_4330;
  FunctionStruct local_4328;
  code *local_42c8;
  undefined8 uStack_42c0;
  code *local_42b8;
  undefined8 uStack_42b0;
  code *local_42a8;
  undefined8 uStack_42a0;
  code *local_4298;
  undefined8 uStack_4290;
  code *local_4288;
  undefined8 local_4280;
  code *local_4278;
  undefined8 local_4270;
  FunctionStruct local_4268;
  code *local_4208;
  undefined8 uStack_4200;
  code *local_41f8;
  undefined8 uStack_41f0;
  code *local_41e8;
  undefined8 uStack_41e0;
  code *local_41d8;
  undefined8 uStack_41d0;
  code *local_41c8;
  undefined8 local_41c0;
  code *local_41b8;
  undefined8 local_41b0;
  FunctionStruct local_41a8;
  code *local_4148;
  undefined8 uStack_4140;
  code *local_4138;
  undefined8 uStack_4130;
  code *local_4128;
  undefined8 uStack_4120;
  code *local_4118;
  undefined8 uStack_4110;
  code *local_4108;
  undefined8 local_4100;
  code *local_40f8;
  undefined8 local_40f0;
  FunctionStruct local_40e8;
  code *local_4088;
  undefined8 uStack_4080;
  code *local_4078;
  undefined8 uStack_4070;
  code *local_4068;
  undefined8 uStack_4060;
  code *local_4058;
  undefined8 uStack_4050;
  code *local_4048;
  undefined8 local_4040;
  code *local_4038;
  undefined8 local_4030;
  FunctionStruct local_4028;
  code *local_3fc8;
  undefined8 uStack_3fc0;
  code *local_3fb8;
  undefined8 uStack_3fb0;
  code *local_3fa8;
  undefined8 uStack_3fa0;
  code *local_3f98;
  undefined8 uStack_3f90;
  code *local_3f88;
  undefined8 local_3f80;
  code *local_3f78;
  undefined8 local_3f70;
  FunctionStruct local_3f68;
  code *local_3f08;
  undefined8 uStack_3f00;
  code *local_3ef8;
  undefined8 uStack_3ef0;
  code *local_3ee8;
  undefined8 uStack_3ee0;
  code *local_3ed8;
  undefined8 uStack_3ed0;
  code *local_3ec8;
  undefined8 local_3ec0;
  code *local_3eb8;
  undefined8 local_3eb0;
  FunctionStruct local_3ea8;
  code *local_3e48;
  undefined8 uStack_3e40;
  code *local_3e38;
  undefined8 uStack_3e30;
  code *local_3e28;
  undefined8 uStack_3e20;
  code *local_3e18;
  undefined8 uStack_3e10;
  code *local_3e08;
  undefined8 local_3e00;
  code *local_3df8;
  undefined8 local_3df0;
  FunctionStruct local_3de8;
  code *local_3d88;
  undefined8 uStack_3d80;
  code *local_3d78;
  undefined8 uStack_3d70;
  code *local_3d68;
  undefined8 uStack_3d60;
  code *local_3d58;
  undefined8 uStack_3d50;
  code *local_3d48;
  undefined8 local_3d40;
  code *local_3d38;
  undefined8 local_3d30;
  FunctionStruct local_3d28;
  code *local_3cc8;
  undefined8 uStack_3cc0;
  code *local_3cb8;
  undefined8 uStack_3cb0;
  code *local_3ca8;
  undefined8 uStack_3ca0;
  code *local_3c98;
  undefined8 uStack_3c90;
  code *local_3c88;
  undefined8 local_3c80;
  code *local_3c78;
  undefined8 local_3c70;
  FunctionStruct local_3c68;
  code *local_3c08;
  undefined8 uStack_3c00;
  code *local_3bf8;
  undefined8 uStack_3bf0;
  code *local_3be8;
  undefined8 uStack_3be0;
  code *local_3bd8;
  undefined8 uStack_3bd0;
  code *local_3bc8;
  undefined8 local_3bc0;
  code *local_3bb8;
  undefined8 local_3bb0;
  FunctionStruct local_3ba8;
  code *local_3b48;
  undefined8 uStack_3b40;
  code *local_3b38;
  undefined8 uStack_3b30;
  code *local_3b28;
  undefined8 uStack_3b20;
  code *local_3b18;
  undefined8 uStack_3b10;
  code *local_3b08;
  undefined8 local_3b00;
  code *local_3af8;
  undefined8 local_3af0;
  FunctionStruct local_3ae8;
  code *local_3a88;
  undefined8 uStack_3a80;
  code *local_3a78;
  undefined8 uStack_3a70;
  code *local_3a68;
  undefined8 uStack_3a60;
  code *local_3a58;
  undefined8 uStack_3a50;
  code *local_3a48;
  undefined8 local_3a40;
  code *local_3a38;
  undefined8 local_3a30;
  FunctionStruct local_3a28;
  code *local_39c8;
  undefined8 uStack_39c0;
  code *local_39b8;
  undefined8 uStack_39b0;
  code *local_39a8;
  undefined8 uStack_39a0;
  code *local_3998;
  undefined8 uStack_3990;
  code *local_3988;
  undefined8 local_3980;
  code *local_3978;
  undefined8 local_3970;
  FunctionStruct local_3968;
  code *local_3908;
  undefined8 uStack_3900;
  code *local_38f8;
  undefined8 uStack_38f0;
  code *local_38e8;
  undefined8 uStack_38e0;
  code *local_38d8;
  undefined8 uStack_38d0;
  code *local_38c8;
  undefined8 local_38c0;
  code *local_38b8;
  undefined8 local_38b0;
  FunctionStruct local_38a8;
  code *local_3848;
  undefined8 uStack_3840;
  code *local_3838;
  undefined8 uStack_3830;
  code *local_3828;
  undefined8 uStack_3820;
  code *local_3818;
  undefined8 uStack_3810;
  code *local_3808;
  undefined8 local_3800;
  code *local_37f8;
  undefined8 local_37f0;
  FunctionStruct local_37e8;
  code *local_3788;
  undefined8 uStack_3780;
  code *local_3778;
  undefined8 uStack_3770;
  code *local_3768;
  undefined8 uStack_3760;
  code *local_3758;
  undefined8 uStack_3750;
  code *local_3748;
  undefined8 local_3740;
  code *local_3738;
  undefined8 local_3730;
  FunctionStruct local_3728;
  code *local_36c8;
  undefined8 uStack_36c0;
  code *local_36b8;
  undefined8 uStack_36b0;
  code *local_36a8;
  undefined8 uStack_36a0;
  code *local_3698;
  undefined8 uStack_3690;
  code *local_3688;
  undefined8 local_3680;
  code *local_3678;
  undefined8 local_3670;
  FunctionStruct local_3668;
  code *local_3608;
  undefined8 uStack_3600;
  code *local_35f8;
  undefined8 uStack_35f0;
  code *local_35e8;
  undefined8 uStack_35e0;
  code *local_35d8;
  undefined8 uStack_35d0;
  code *local_35c8;
  undefined8 local_35c0;
  code *local_35b8;
  undefined8 local_35b0;
  FunctionStruct local_35a8;
  code *local_3548;
  undefined8 uStack_3540;
  code *local_3538;
  undefined8 uStack_3530;
  code *local_3528;
  undefined8 uStack_3520;
  code *local_3518;
  undefined8 uStack_3510;
  code *local_3508;
  undefined8 local_3500;
  code *local_34f8;
  undefined8 local_34f0;
  FunctionStruct local_34e8;
  code *local_3488;
  undefined8 uStack_3480;
  code *local_3478;
  undefined8 uStack_3470;
  code *local_3468;
  undefined8 uStack_3460;
  code *local_3458;
  undefined8 uStack_3450;
  code *local_3448;
  undefined8 local_3440;
  code *local_3438;
  undefined8 local_3430;
  FunctionStruct local_3428;
  code *local_33c8;
  undefined8 uStack_33c0;
  code *local_33b8;
  undefined8 uStack_33b0;
  code *local_33a8;
  undefined8 uStack_33a0;
  code *local_3398;
  undefined8 uStack_3390;
  code *local_3388;
  undefined8 local_3380;
  code *local_3378;
  undefined8 local_3370;
  FunctionStruct local_3368;
  code *local_3308;
  undefined8 uStack_3300;
  code *local_32f8;
  undefined8 uStack_32f0;
  code *local_32e8;
  undefined8 uStack_32e0;
  code *local_32d8;
  undefined8 uStack_32d0;
  code *local_32c8;
  undefined8 local_32c0;
  code *local_32b8;
  undefined8 local_32b0;
  FunctionStruct local_32a8;
  code *local_3248;
  undefined8 uStack_3240;
  code *local_3238;
  undefined8 uStack_3230;
  code *local_3228;
  undefined8 uStack_3220;
  code *local_3218;
  undefined8 uStack_3210;
  code *local_3208;
  undefined8 local_3200;
  code *local_31f8;
  undefined8 local_31f0;
  FunctionStruct local_31e8;
  code *local_3188;
  undefined8 uStack_3180;
  code *local_3178;
  undefined8 uStack_3170;
  code *local_3168;
  undefined8 uStack_3160;
  code *local_3158;
  undefined8 uStack_3150;
  code *local_3148;
  undefined8 local_3140;
  code *local_3138;
  undefined8 local_3130;
  FunctionStruct local_3128;
  code *local_30c8;
  undefined8 uStack_30c0;
  code *local_30b8;
  undefined8 uStack_30b0;
  code *local_30a8;
  undefined8 uStack_30a0;
  code *local_3098;
  undefined8 uStack_3090;
  code *local_3088;
  undefined8 local_3080;
  code *local_3078;
  undefined8 local_3070;
  FunctionStruct local_3068;
  code *local_3008;
  undefined8 uStack_3000;
  code *local_2ff8;
  undefined8 uStack_2ff0;
  code *local_2fe8;
  undefined8 uStack_2fe0;
  code *local_2fd8;
  undefined8 uStack_2fd0;
  code *local_2fc8;
  undefined8 local_2fc0;
  code *local_2fb8;
  undefined8 local_2fb0;
  FunctionStruct local_2fa8;
  code *local_2f48;
  undefined8 uStack_2f40;
  code *local_2f38;
  undefined8 uStack_2f30;
  code *local_2f28;
  undefined8 uStack_2f20;
  code *local_2f18;
  undefined8 uStack_2f10;
  code *local_2f08;
  undefined8 local_2f00;
  code *local_2ef8;
  undefined8 local_2ef0;
  FunctionStruct local_2ee8;
  code *local_2e88;
  undefined8 uStack_2e80;
  code *local_2e78;
  undefined8 uStack_2e70;
  code *local_2e68;
  undefined8 uStack_2e60;
  code *local_2e58;
  undefined8 uStack_2e50;
  code *local_2e48;
  undefined8 local_2e40;
  code *local_2e38;
  undefined8 local_2e30;
  FunctionStruct local_2e28;
  code *local_2dc8;
  undefined8 uStack_2dc0;
  code *local_2db8;
  undefined8 uStack_2db0;
  code *local_2da8;
  undefined8 uStack_2da0;
  code *local_2d98;
  undefined8 uStack_2d90;
  code *local_2d88;
  undefined8 local_2d80;
  code *local_2d78;
  undefined8 local_2d70;
  FunctionStruct local_2d68;
  code *local_2d08;
  undefined8 uStack_2d00;
  code *local_2cf8;
  undefined8 uStack_2cf0;
  code *local_2ce8;
  undefined8 uStack_2ce0;
  code *local_2cd8;
  undefined8 uStack_2cd0;
  code *local_2cc8;
  undefined8 local_2cc0;
  code *local_2cb8;
  undefined8 local_2cb0;
  FunctionStruct local_2ca8;
  code *local_2c48;
  undefined8 uStack_2c40;
  code *local_2c38;
  undefined8 uStack_2c30;
  code *local_2c28;
  undefined8 uStack_2c20;
  code *local_2c18;
  undefined8 uStack_2c10;
  code *local_2c08;
  undefined8 local_2c00;
  code *local_2bf8;
  undefined8 local_2bf0;
  FunctionStruct local_2be8;
  code *local_2b88;
  undefined8 uStack_2b80;
  code *local_2b78;
  undefined8 uStack_2b70;
  code *local_2b68;
  undefined8 uStack_2b60;
  code *local_2b58;
  undefined8 uStack_2b50;
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
  *local_2b48;
  undefined8 local_2b40;
  code *local_2b38;
  undefined8 local_2b30;
  FunctionStruct local_2b28;
  code *local_2ac8;
  undefined8 uStack_2ac0;
  code *local_2ab8;
  undefined8 uStack_2ab0;
  code *local_2aa8;
  undefined8 uStack_2aa0;
  code *local_2a98;
  undefined8 uStack_2a90;
  code *local_2a88;
  undefined8 local_2a80;
  code *local_2a78;
  undefined8 local_2a70;
  FunctionStruct local_2a68;
  code *local_2a08;
  undefined8 uStack_2a00;
  code *local_29f8;
  undefined8 uStack_29f0;
  code *local_29e8;
  undefined8 uStack_29e0;
  code *local_29d8;
  undefined8 uStack_29d0;
  code *local_29c8;
  undefined8 local_29c0;
  code *local_29b8;
  undefined8 local_29b0;
  FunctionStruct local_29a8;
  code *local_2948;
  undefined8 uStack_2940;
  code *local_2938;
  undefined8 uStack_2930;
  code *local_2928;
  undefined8 uStack_2920;
  code *local_2918;
  undefined8 uStack_2910;
  code *local_2908;
  undefined8 local_2900;
  code *local_28f8;
  undefined8 local_28f0;
  FunctionStruct local_28e8;
  code *local_2888;
  undefined8 uStack_2880;
  code *local_2878;
  undefined8 uStack_2870;
  code *local_2868;
  undefined8 uStack_2860;
  code *local_2858;
  undefined8 uStack_2850;
  code *local_2848;
  undefined8 local_2840;
  code *local_2838;
  undefined8 local_2830;
  FunctionStruct local_2828;
  code *local_27c8;
  undefined8 uStack_27c0;
  code *local_27b8;
  undefined8 uStack_27b0;
  code *local_27a8;
  undefined8 uStack_27a0;
  code *local_2798;
  undefined8 uStack_2790;
  code *local_2788;
  undefined8 local_2780;
  code *local_2778;
  undefined8 local_2770;
  FunctionStruct local_2768;
  code *local_2708;
  undefined8 uStack_2700;
  code *local_26f8;
  undefined8 uStack_26f0;
  code *local_26e8;
  undefined8 uStack_26e0;
  code *local_26d8;
  undefined8 uStack_26d0;
  code *local_26c8;
  undefined8 local_26c0;
  code *local_26b8;
  undefined8 local_26b0;
  FunctionStruct local_26a8;
  code *local_2648;
  undefined8 uStack_2640;
  code *local_2638;
  undefined8 uStack_2630;
  code *local_2628;
  undefined8 uStack_2620;
  code *local_2618;
  undefined8 uStack_2610;
  code *local_2608;
  undefined8 local_2600;
  code *local_25f8;
  undefined8 local_25f0;
  FunctionStruct local_25e8;
  code *local_2588;
  undefined8 uStack_2580;
  code *local_2578;
  undefined8 uStack_2570;
  code *local_2568;
  undefined8 uStack_2560;
  code *local_2558;
  undefined8 uStack_2550;
  code *local_2548;
  undefined8 local_2540;
  code *local_2538;
  undefined8 local_2530;
  FunctionStruct local_2528;
  code *local_24c8;
  undefined8 uStack_24c0;
  code *local_24b8;
  undefined8 uStack_24b0;
  code *local_24a8;
  undefined8 uStack_24a0;
  code *local_2498;
  undefined8 uStack_2490;
  code *local_2488;
  undefined8 local_2480;
  code *local_2478;
  undefined8 local_2470;
  FunctionStruct local_2468;
  code *local_2408;
  undefined8 uStack_2400;
  code *local_23f8;
  undefined8 uStack_23f0;
  code *local_23e8;
  undefined8 uStack_23e0;
  code *local_23d8;
  undefined8 uStack_23d0;
  code *local_23c8;
  undefined8 local_23c0;
  code *local_23b8;
  undefined8 local_23b0;
  FunctionStruct local_23a8;
  code *local_2348;
  undefined8 uStack_2340;
  code *local_2338;
  undefined8 uStack_2330;
  code *local_2328;
  undefined8 uStack_2320;
  code *local_2318;
  undefined8 uStack_2310;
  code *local_2308;
  undefined8 local_2300;
  code *local_22f8;
  undefined8 local_22f0;
  FunctionStruct local_22e8;
  code *local_2288;
  undefined8 uStack_2280;
  code *local_2278;
  undefined8 uStack_2270;
  code *local_2268;
  undefined8 uStack_2260;
  code *local_2258;
  undefined8 uStack_2250;
  code *local_2248;
  undefined8 local_2240;
  code *local_2238;
  undefined8 local_2230;
  FunctionStruct local_2228;
  code *local_21c8;
  undefined8 uStack_21c0;
  code *local_21b8;
  undefined8 uStack_21b0;
  code *local_21a8;
  undefined8 uStack_21a0;
  code *local_2198;
  undefined8 uStack_2190;
  code *local_2188;
  undefined8 local_2180;
  code *local_2178;
  undefined8 local_2170;
  FunctionStruct local_2168;
  code *local_2108;
  undefined8 uStack_2100;
  code *local_20f8;
  undefined8 uStack_20f0;
  code *local_20e8;
  undefined8 uStack_20e0;
  code *local_20d8;
  undefined8 uStack_20d0;
  code *local_20c8;
  undefined8 local_20c0;
  code *local_20b8;
  undefined8 local_20b0;
  FunctionStruct local_20a8;
  code *local_2048;
  undefined8 uStack_2040;
  code *local_2038;
  undefined8 uStack_2030;
  code *local_2028;
  undefined8 uStack_2020;
  code *local_2018;
  undefined8 uStack_2010;
  code *local_2008;
  undefined8 local_2000;
  code *local_1ff8;
  undefined8 local_1ff0;
  FunctionStruct local_1fe8;
  code *local_1f88;
  undefined8 uStack_1f80;
  code *local_1f78;
  undefined8 uStack_1f70;
  code *local_1f68;
  undefined8 uStack_1f60;
  code *local_1f58;
  undefined8 uStack_1f50;
  code *local_1f48;
  undefined8 local_1f40;
  code *local_1f38;
  undefined8 local_1f30;
  FunctionStruct local_1f28;
  code *local_1ec8;
  undefined8 uStack_1ec0;
  code *local_1eb8;
  undefined8 uStack_1eb0;
  code *local_1ea8;
  undefined8 uStack_1ea0;
  code *local_1e98;
  undefined8 uStack_1e90;
  code *local_1e88;
  undefined8 local_1e80;
  code *local_1e78;
  undefined8 local_1e70;
  FunctionStruct local_1e68;
  code *local_1e08;
  undefined8 uStack_1e00;
  code *local_1df8;
  undefined8 uStack_1df0;
  code *local_1de8;
  undefined8 uStack_1de0;
  code *local_1dd8;
  undefined8 uStack_1dd0;
  code *local_1dc8;
  undefined8 local_1dc0;
  code *local_1db8;
  undefined8 local_1db0;
  FunctionStruct local_1da8;
  code *local_1d48;
  undefined8 uStack_1d40;
  code *local_1d38;
  undefined8 uStack_1d30;
  code *local_1d28;
  undefined8 uStack_1d20;
  code *local_1d18;
  undefined8 uStack_1d10;
  code *local_1d08;
  undefined8 local_1d00;
  code *local_1cf8;
  undefined8 local_1cf0;
  FunctionStruct local_1ce8;
  code *local_1c88;
  undefined8 uStack_1c80;
  code *local_1c78;
  undefined8 uStack_1c70;
  code *local_1c68;
  undefined8 uStack_1c60;
  code *local_1c58;
  undefined8 uStack_1c50;
  code *local_1c48;
  undefined8 local_1c40;
  code *local_1c38;
  undefined8 local_1c30;
  FunctionStruct local_1c28;
  code *local_1bc8;
  undefined8 uStack_1bc0;
  code *local_1bb8;
  undefined8 uStack_1bb0;
  code *local_1ba8;
  undefined8 uStack_1ba0;
  code *local_1b98;
  undefined8 uStack_1b90;
  code *local_1b88;
  undefined8 local_1b80;
  code *local_1b78;
  undefined8 local_1b70;
  FunctionStruct local_1b68;
  code *local_1b08;
  undefined8 uStack_1b00;
  code *local_1af8;
  undefined8 uStack_1af0;
  code *local_1ae8;
  undefined8 uStack_1ae0;
  code *local_1ad8;
  undefined8 uStack_1ad0;
  code *local_1ac8;
  undefined8 local_1ac0;
  code *local_1ab8;
  undefined8 local_1ab0;
  FunctionStruct local_1aa8;
  code *local_1a48;
  undefined8 uStack_1a40;
  code *local_1a38;
  undefined8 uStack_1a30;
  code *local_1a28;
  undefined8 uStack_1a20;
  code *local_1a18;
  undefined8 uStack_1a10;
  code *local_1a08;
  undefined8 local_1a00;
  code *local_19f8;
  undefined8 local_19f0;
  FunctionStruct local_19e8;
  code *local_1988;
  undefined8 uStack_1980;
  code *local_1978;
  undefined8 uStack_1970;
  code *local_1968;
  undefined8 uStack_1960;
  code *local_1958;
  undefined8 uStack_1950;
  code *local_1948;
  undefined8 local_1940;
  code *local_1938;
  undefined8 local_1930;
  FunctionStruct local_1928;
  code *local_18c8;
  undefined8 uStack_18c0;
  code *local_18b8;
  undefined8 uStack_18b0;
  code *local_18a8;
  undefined8 uStack_18a0;
  code *local_1898;
  undefined8 uStack_1890;
  code *local_1888;
  undefined8 local_1880;
  code *local_1878;
  undefined8 local_1870;
  FunctionStruct local_1868;
  code *local_1808;
  undefined8 uStack_1800;
  code *local_17f8;
  undefined8 uStack_17f0;
  code *local_17e8;
  undefined8 uStack_17e0;
  code *local_17d8;
  undefined8 uStack_17d0;
  code *local_17c8;
  undefined8 local_17c0;
  code *local_17b8;
  undefined8 local_17b0;
  FunctionStruct local_17a8;
  code *local_1748;
  undefined8 uStack_1740;
  code *local_1738;
  undefined8 uStack_1730;
  code *local_1728;
  undefined8 uStack_1720;
  code *local_1718;
  undefined8 uStack_1710;
  code *local_1708;
  undefined8 local_1700;
  code *local_16f8;
  undefined8 local_16f0;
  FunctionStruct local_16e8;
  code *local_1688;
  undefined8 uStack_1680;
  code *local_1678;
  undefined8 uStack_1670;
  code *local_1668;
  undefined8 uStack_1660;
  code *local_1658;
  undefined8 uStack_1650;
  code *local_1648;
  undefined8 local_1640;
  code *local_1638;
  undefined8 local_1630;
  FunctionStruct local_1628;
  code *local_15c8;
  undefined8 uStack_15c0;
  code *local_15b8;
  undefined8 uStack_15b0;
  code *local_15a8;
  undefined8 uStack_15a0;
  code *local_1598;
  undefined8 uStack_1590;
  code *local_1588;
  undefined8 local_1580;
  code *local_1578;
  undefined8 local_1570;
  FunctionStruct local_1568;
  code *local_1508;
  undefined8 uStack_1500;
  code *local_14f8;
  undefined8 uStack_14f0;
  code *local_14e8;
  undefined8 uStack_14e0;
  code *local_14d8;
  undefined8 uStack_14d0;
  code *local_14c8;
  undefined8 local_14c0;
  code *local_14b8;
  undefined8 local_14b0;
  FunctionStruct local_14a8;
  code *local_1448;
  undefined8 uStack_1440;
  code *local_1438;
  undefined8 uStack_1430;
  code *local_1428;
  undefined8 uStack_1420;
  code *local_1418;
  undefined8 uStack_1410;
  code *local_1408;
  undefined8 local_1400;
  code *local_13f8;
  undefined8 local_13f0;
  FunctionStruct local_13e8;
  code *local_1388;
  undefined8 uStack_1380;
  code *local_1378;
  undefined8 uStack_1370;
  code *local_1368;
  undefined8 uStack_1360;
  code *local_1358;
  undefined8 uStack_1350;
  code *local_1348;
  undefined8 local_1340;
  code *local_1338;
  undefined8 local_1330;
  FunctionStruct local_1328;
  code *local_12c8;
  undefined8 uStack_12c0;
  code *local_12b8;
  undefined8 uStack_12b0;
  code *local_12a8;
  undefined8 uStack_12a0;
  code *local_1298;
  undefined8 uStack_1290;
  code *local_1288;
  undefined8 local_1280;
  code *local_1278;
  undefined8 local_1270;
  FunctionStruct local_1268;
  code *local_1208;
  undefined8 uStack_1200;
  code *local_11f8;
  undefined8 uStack_11f0;
  code *local_11e8;
  undefined8 uStack_11e0;
  code *local_11d8;
  undefined8 uStack_11d0;
  code *local_11c8;
  undefined8 local_11c0;
  code *local_11b8;
  undefined8 local_11b0;
  FunctionStruct local_11a8;
  code *local_1148;
  undefined8 uStack_1140;
  code *local_1138;
  undefined8 uStack_1130;
  code *local_1128;
  undefined8 uStack_1120;
  code *local_1118;
  undefined8 uStack_1110;
  code *local_1108;
  undefined8 local_1100;
  code *local_10f8;
  undefined8 local_10f0;
  FunctionStruct local_10e8;
  code *local_1088;
  undefined8 uStack_1080;
  code *local_1078;
  undefined8 uStack_1070;
  code *local_1068;
  undefined8 uStack_1060;
  code *local_1058;
  undefined8 uStack_1050;
  code *local_1048;
  undefined8 local_1040;
  code *local_1038;
  undefined8 local_1030;
  FunctionStruct local_1028;
  code *local_fc8;
  undefined8 uStack_fc0;
  code *local_fb8;
  undefined8 uStack_fb0;
  code *local_fa8;
  undefined8 uStack_fa0;
  code *local_f98;
  undefined8 uStack_f90;
  code *local_f88;
  undefined8 local_f80;
  code *local_f78;
  undefined8 local_f70;
  FunctionStruct local_f68;
  code *local_f08;
  undefined8 uStack_f00;
  code *local_ef8;
  undefined8 uStack_ef0;
  code *local_ee8;
  undefined8 uStack_ee0;
  code *local_ed8;
  undefined8 uStack_ed0;
  code *local_ec8;
  undefined8 local_ec0;
  code *local_eb8;
  undefined8 local_eb0;
  FunctionStruct local_ea8;
  code *local_e48;
  undefined8 uStack_e40;
  code *local_e38;
  undefined8 uStack_e30;
  code *local_e28;
  undefined8 uStack_e20;
  code *local_e18;
  undefined8 uStack_e10;
  code *local_e08;
  undefined8 local_e00;
  code *local_df8;
  undefined8 local_df0;
  FunctionStruct local_de8;
  code *local_d88;
  undefined8 uStack_d80;
  code *local_d78;
  undefined8 uStack_d70;
  code *local_d68;
  undefined8 uStack_d60;
  code *local_d58;
  undefined8 uStack_d50;
  code *local_d48;
  undefined8 local_d40;
  code *local_d38;
  undefined8 local_d30;
  FunctionStruct local_d28;
  code *local_cc8;
  undefined8 uStack_cc0;
  code *local_cb8;
  undefined8 uStack_cb0;
  code *local_ca8;
  undefined8 uStack_ca0;
  code *local_c98;
  undefined8 uStack_c90;
  code *local_c88;
  undefined8 local_c80;
  code *local_c78;
  undefined8 local_c70;
  FunctionStruct local_c68;
  code *local_c08;
  undefined8 uStack_c00;
  code *local_bf8;
  undefined8 uStack_bf0;
  code *local_be8;
  undefined8 uStack_be0;
  code *local_bd8;
  undefined8 uStack_bd0;
  code *local_bc8;
  undefined8 local_bc0;
  code *local_bb8;
  undefined8 local_bb0;
  FunctionStruct local_ba8;
  code *local_b48;
  undefined8 uStack_b40;
  code *local_b38;
  undefined8 uStack_b30;
  code *local_b28;
  undefined8 uStack_b20;
  code *local_b18;
  undefined8 uStack_b10;
  code *local_b08;
  undefined8 local_b00;
  code *local_af8;
  undefined8 local_af0;
  FunctionStruct local_ae8;
  code *local_a88;
  undefined8 uStack_a80;
  code *local_a78;
  undefined8 uStack_a70;
  code *local_a68;
  undefined8 uStack_a60;
  code *local_a58;
  undefined8 uStack_a50;
  code *local_a48;
  undefined8 local_a40;
  code *local_a38;
  undefined8 local_a30;
  FunctionStruct local_a28;
  code *local_9c8;
  undefined8 uStack_9c0;
  code *local_9b8;
  undefined8 uStack_9b0;
  code *local_9a8;
  undefined8 uStack_9a0;
  code *local_998;
  undefined8 uStack_990;
  code *local_988;
  undefined8 local_980;
  code *local_978;
  undefined8 local_970;
  FunctionStruct local_968;
  code *local_908;
  undefined8 uStack_900;
  code *local_8f8;
  undefined8 uStack_8f0;
  code *local_8e8;
  undefined8 uStack_8e0;
  code *local_8d8;
  undefined8 uStack_8d0;
  code *local_8c8;
  undefined8 local_8c0;
  code *local_8b8;
  undefined8 local_8b0;
  FunctionStruct local_8a8;
  code *local_848;
  undefined8 uStack_840;
  code *local_838;
  undefined8 uStack_830;
  code *local_828;
  undefined8 uStack_820;
  code *local_818;
  undefined8 uStack_810;
  code *local_808;
  undefined8 local_800;
  code *local_7f8;
  undefined8 local_7f0;
  FunctionStruct local_7e8;
  code *local_788;
  undefined8 uStack_780;
  code *local_778;
  undefined8 uStack_770;
  code *local_768;
  undefined8 uStack_760;
  code *local_758;
  undefined8 uStack_750;
  code *local_748;
  undefined8 local_740;
  code *local_738;
  undefined8 local_730;
  FunctionStruct local_728;
  code *local_6c8;
  undefined8 uStack_6c0;
  code *local_6b8;
  undefined8 uStack_6b0;
  code *local_6a8;
  undefined8 uStack_6a0;
  code *local_698;
  undefined8 uStack_690;
  code *local_688;
  undefined8 local_680;
  code *local_678;
  undefined8 local_670;
  FunctionStruct local_668;
  code *local_608;
  undefined8 uStack_600;
  code *local_5f8;
  undefined8 uStack_5f0;
  code *local_5e8;
  undefined8 uStack_5e0;
  code *local_5d8;
  undefined8 uStack_5d0;
  code *local_5c8;
  undefined8 local_5c0;
  code *local_5b8;
  undefined8 local_5b0;
  FunctionStruct local_5a8;
  code *local_548;
  undefined8 uStack_540;
  code *local_538;
  undefined8 uStack_530;
  code *local_528;
  undefined8 uStack_520;
  code *local_518;
  undefined8 uStack_510;
  code *local_508;
  undefined8 local_500;
  code *local_4f8;
  undefined8 local_4f0;
  FunctionStruct local_4e8;
  code *local_488;
  undefined8 uStack_480;
  code *local_478;
  undefined8 uStack_470;
  code *local_468;
  undefined8 uStack_460;
  code *local_458;
  undefined8 uStack_450;
  code *local_448;
  undefined8 local_440;
  code *local_438;
  undefined8 local_430;
  FunctionStruct local_428;
  code *local_3c8;
  undefined8 uStack_3c0;
  code *local_3b8;
  undefined8 uStack_3b0;
  code *local_3a8;
  undefined8 uStack_3a0;
  code *local_398;
  undefined8 uStack_390;
  code *local_388;
  undefined8 local_380;
  code *local_378;
  undefined8 local_370;
  FunctionStruct local_368;
  code *local_308;
  undefined8 uStack_300;
  code *local_2f8;
  undefined8 uStack_2f0;
  code *local_2e8;
  undefined8 uStack_2e0;
  code *local_2d8;
  undefined8 uStack_2d0;
  code *local_2c8;
  undefined8 local_2c0;
  code *local_2b8;
  undefined8 local_2b0;
  FunctionStruct local_2a8;
  code *local_248;
  undefined8 uStack_240;
  code *local_238;
  undefined8 uStack_230;
  code *local_228;
  undefined8 uStack_220;
  code *local_218;
  undefined8 uStack_210;
  code *local_208;
  undefined8 local_200;
  code *local_1f8;
  undefined8 local_1f0;
  FunctionStruct local_1e8;
  code *local_188;
  undefined8 uStack_180;
  code *local_178;
  undefined8 uStack_170;
  code *local_168;
  undefined8 uStack_160;
  code *local_158;
  undefined8 uStack_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  undefined8 local_130;
  FunctionStruct local_128;
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  FunctionStruct local_68;
  
  if (createFunctionMap__library_physics_models__allChildren()::functionMap == '\0') {
    iVar1 = __cxa_guard_acquire(&createFunctionMap__library_physics_models__allChildren()::
                                 functionMap);
    if (iVar1 != 0) {
      std::
      map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
      ::map((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             *)0x830eae);
      __cxa_atexit(std::
                   map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                   ::~map,&createFunctionMap__library_physics_models__allChildren::functionMap,
                   &__dso_handle);
      __cxa_guard_release(&createFunctionMap__library_physics_models__allChildren()::functionMap);
    }
  }
  if ((createFunctionMap__library_physics_models__allChildren::mapFilled & 1U) == 0) {
    local_78 = ColladaParserAutoGen14Private::_begin__COLLADA;
    local_70 = 0;
    local_88 = ColladaParserAutoGen14Private::_data__COLLADA;
    local_80 = 0;
    local_98 = ColladaParserAutoGen14Private::_end__COLLADA;
    uStack_90 = 0;
    local_a8 = ColladaParserAutoGen14Private::_preBegin__COLLADA;
    uStack_a0 = 0;
    local_b8 = ColladaParserAutoGen14Private::_preEnd__COLLADA;
    uStack_b0 = 0;
    local_c8 = ColladaParserAutoGen14Private::_freeAttributes__COLLADA;
    uStack_c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_68,0x84d880,0,0x85c460,0,in_R9,0x84d8b0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_68._88_8_;
    pmVar2->validateEndFunction = local_68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_68._72_8_;
    pmVar2->validateBeginFunction = local_68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_68._56_8_;
    pmVar2->endFunction = local_68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_68._40_8_;
    pmVar2->textDataFunction = local_68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_68._24_8_;
    pmVar2->beginFunction = local_68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_68._8_8_;
    local_138 = ColladaParserAutoGen14Private::_begin__library_physics_models;
    local_130 = 0;
    local_148 = ColladaParserAutoGen14Private::_data__library_physics_models;
    local_140 = 0;
    local_158 = ColladaParserAutoGen14Private::_end__library_physics_models;
    uStack_150 = 0;
    local_168 = ColladaParserAutoGen14Private::_preBegin__library_physics_models;
    uStack_160 = 0;
    local_178 = ColladaParserAutoGen14Private::_preEnd__library_physics_models;
    uStack_170 = 0;
    local_188 = ColladaParserAutoGen14Private::_freeAttributes__library_physics_models;
    uStack_180 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_128,0x84df60,0,0x872af0,0,in_R9,0x84df90);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_128.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_128._88_8_;
    pmVar2->validateEndFunction = local_128.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_128._72_8_;
    pmVar2->validateBeginFunction = local_128.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_128._56_8_;
    pmVar2->endFunction = local_128.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_128._40_8_;
    pmVar2->textDataFunction = local_128.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_128._24_8_;
    pmVar2->beginFunction = local_128.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_128._8_8_;
    local_1f8 = ColladaParserAutoGen14Private::_begin__asset;
    local_1f0 = 0;
    local_208 = ColladaParserAutoGen14Private::_data__asset;
    local_200 = 0;
    local_218 = ColladaParserAutoGen14Private::_end__asset;
    uStack_210 = 0;
    local_228 = ColladaParserAutoGen14Private::_preBegin__asset;
    uStack_220 = 0;
    local_238 = ColladaParserAutoGen14Private::_preEnd__asset;
    uStack_230 = 0;
    local_248 = ColladaParserAutoGen14Private::_freeAttributes__asset;
    uStack_240 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1e8,0x84db00,0,0x85ca40,0,in_R9,0x84db30);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1e8._88_8_;
    pmVar2->validateEndFunction = local_1e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1e8._72_8_;
    pmVar2->validateBeginFunction = local_1e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1e8._56_8_;
    pmVar2->endFunction = local_1e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1e8._40_8_;
    pmVar2->textDataFunction = local_1e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1e8._24_8_;
    pmVar2->beginFunction = local_1e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1e8._8_8_;
    local_2b8 = ColladaParserAutoGen14Private::_begin__extra;
    local_2b0 = 0;
    local_2c8 = ColladaParserAutoGen14Private::_data__extra;
    local_2c0 = 0;
    local_2d8 = ColladaParserAutoGen14Private::_end__extra;
    uStack_2d0 = 0;
    local_2e8 = ColladaParserAutoGen14Private::_preBegin__extra;
    uStack_2e0 = 0;
    local_2f8 = ColladaParserAutoGen14Private::_preEnd__extra;
    uStack_2f0 = 0;
    local_308 = ColladaParserAutoGen14Private::_freeAttributes__extra;
    uStack_300 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_2a8,0x84db50,0,0x85fb30,0,in_R9,0x84db80);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_2a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2a8._88_8_;
    pmVar2->validateEndFunction = local_2a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2a8._72_8_;
    pmVar2->validateBeginFunction = local_2a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2a8._56_8_;
    pmVar2->endFunction = local_2a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2a8._40_8_;
    pmVar2->textDataFunction = local_2a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2a8._24_8_;
    pmVar2->beginFunction = local_2a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2a8._8_8_;
    local_378 = ColladaParserAutoGen14Private::_begin__physics_model;
    local_370 = 0;
    local_388 = ColladaParserAutoGen14Private::_data__physics_model;
    local_380 = 0;
    local_398 = ColladaParserAutoGen14Private::_end__physics_model;
    uStack_390 = 0;
    local_3a8 = ColladaParserAutoGen14Private::_preBegin__physics_model;
    uStack_3a0 = 0;
    local_3b8 = ColladaParserAutoGen14Private::_preEnd__physics_model;
    uStack_3b0 = 0;
    local_3c8 = ColladaParserAutoGen14Private::_freeAttributes__physics_model;
    uStack_3c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_368,0x84f220,0,0x872c80,0,in_R9,0x84f250);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_368.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_368._88_8_;
    pmVar2->validateEndFunction = local_368.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_368._72_8_;
    pmVar2->validateBeginFunction = local_368.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_368._56_8_;
    pmVar2->endFunction = local_368.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_368._40_8_;
    pmVar2->textDataFunction = local_368.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_368._24_8_;
    pmVar2->beginFunction = local_368.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_368._8_8_;
    local_438 = ColladaParserAutoGen14Private::_begin__contributor;
    local_430 = 0;
    local_448 = ColladaParserAutoGen14Private::_data__contributor;
    local_440 = 0;
    local_458 = ColladaParserAutoGen14Private::_end__contributor;
    uStack_450 = 0;
    local_468 = ColladaParserAutoGen14Private::_preBegin__contributor;
    uStack_460 = 0;
    local_478 = ColladaParserAutoGen14Private::_preEnd__contributor;
    uStack_470 = 0;
    local_488 = ColladaParserAutoGen14Private::_freeAttributes__contributor;
    uStack_480 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_428,0x850350,0,0x85caa0,0,in_R9,0x850380);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_428.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_428._88_8_;
    pmVar2->validateEndFunction = local_428.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_428._72_8_;
    pmVar2->validateBeginFunction = local_428.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_428._56_8_;
    pmVar2->endFunction = local_428.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_428._40_8_;
    pmVar2->textDataFunction = local_428.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_428._24_8_;
    pmVar2->beginFunction = local_428.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_428._8_8_;
    local_4f8 = ColladaParserAutoGen14Private::_begin__created;
    local_4f0 = 0;
    local_508 = ColladaParserAutoGen14Private::_data__created;
    local_500 = 0;
    local_518 = ColladaParserAutoGen14Private::_end__created;
    uStack_510 = 0;
    local_528 = ColladaParserAutoGen14Private::_preBegin__created;
    uStack_520 = 0;
    local_538 = ColladaParserAutoGen14Private::_preEnd__created;
    uStack_530 = 0;
    local_548 = ColladaParserAutoGen14Private::_freeAttributes__created;
    uStack_540 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_4e8,0x8503a0,0,0x85cfe0,0,in_R9,0x8503d0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_4e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4e8._88_8_;
    pmVar2->validateEndFunction = local_4e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4e8._72_8_;
    pmVar2->validateBeginFunction = local_4e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4e8._56_8_;
    pmVar2->endFunction = local_4e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4e8._40_8_;
    pmVar2->textDataFunction = local_4e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4e8._24_8_;
    pmVar2->beginFunction = local_4e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4e8._8_8_;
    local_5b8 = ColladaParserAutoGen14Private::_begin__keywords;
    local_5b0 = 0;
    local_5c8 = ColladaParserAutoGen14Private::_data__keywords;
    local_5c0 = 0;
    local_5d8 = ColladaParserAutoGen14Private::_end__keywords;
    uStack_5d0 = 0;
    local_5e8 = ColladaParserAutoGen14Private::_preBegin__keywords;
    uStack_5e0 = 0;
    local_5f8 = ColladaParserAutoGen14Private::_preEnd__keywords;
    uStack_5f0 = 0;
    local_608 = ColladaParserAutoGen14Private::_freeAttributes__keywords;
    uStack_600 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_5a8,0x8503f0,0,0x85d060,0,in_R9,0x850420);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_5a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_5a8._88_8_;
    pmVar2->validateEndFunction = local_5a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_5a8._72_8_;
    pmVar2->validateBeginFunction = local_5a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_5a8._56_8_;
    pmVar2->endFunction = local_5a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_5a8._40_8_;
    pmVar2->textDataFunction = local_5a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_5a8._24_8_;
    pmVar2->beginFunction = local_5a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_5a8._8_8_;
    local_678 = ColladaParserAutoGen14Private::_begin__modified;
    local_670 = 0;
    local_688 = ColladaParserAutoGen14Private::_data__modified;
    local_680 = 0;
    local_698 = ColladaParserAutoGen14Private::_end__modified;
    uStack_690 = 0;
    local_6a8 = ColladaParserAutoGen14Private::_preBegin__modified;
    uStack_6a0 = 0;
    local_6b8 = ColladaParserAutoGen14Private::_preEnd__modified;
    uStack_6b0 = 0;
    local_6c8 = ColladaParserAutoGen14Private::_freeAttributes__modified;
    uStack_6c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_668,0x850440,0,0x85d0e0,0,in_R9,0x850470);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_668.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_668._88_8_;
    pmVar2->validateEndFunction = local_668.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_668._72_8_;
    pmVar2->validateBeginFunction = local_668.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_668._56_8_;
    pmVar2->endFunction = local_668.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_668._40_8_;
    pmVar2->textDataFunction = local_668.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_668._24_8_;
    pmVar2->beginFunction = local_668.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_668._8_8_;
    local_738 = ColladaParserAutoGen14Private::_begin__revision;
    local_730 = 0;
    local_748 = ColladaParserAutoGen14Private::_data__revision;
    local_740 = 0;
    local_758 = ColladaParserAutoGen14Private::_end__revision;
    uStack_750 = 0;
    local_768 = ColladaParserAutoGen14Private::_preBegin__revision;
    uStack_760 = 0;
    local_778 = ColladaParserAutoGen14Private::_preEnd__revision;
    uStack_770 = 0;
    local_788 = ColladaParserAutoGen14Private::_freeAttributes__revision;
    uStack_780 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_728,0x850490,0,0x85d160,0,in_R9,0x8504c0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_728.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_728._88_8_;
    pmVar2->validateEndFunction = local_728.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_728._72_8_;
    pmVar2->validateBeginFunction = local_728.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_728._56_8_;
    pmVar2->endFunction = local_728.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_728._40_8_;
    pmVar2->textDataFunction = local_728.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_728._24_8_;
    pmVar2->beginFunction = local_728.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_728._8_8_;
    local_7f8 = ColladaParserAutoGen14Private::_begin__subject;
    local_7f0 = 0;
    local_808 = ColladaParserAutoGen14Private::_data__subject;
    local_800 = 0;
    local_818 = ColladaParserAutoGen14Private::_end__subject;
    uStack_810 = 0;
    local_828 = ColladaParserAutoGen14Private::_preBegin__subject;
    uStack_820 = 0;
    local_838 = ColladaParserAutoGen14Private::_preEnd__subject;
    uStack_830 = 0;
    local_848 = ColladaParserAutoGen14Private::_freeAttributes__subject;
    uStack_840 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_7e8,0x8504e0,0,0x85d1e0,0,in_R9,0x850510);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_7e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_7e8._88_8_;
    pmVar2->validateEndFunction = local_7e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_7e8._72_8_;
    pmVar2->validateBeginFunction = local_7e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_7e8._56_8_;
    pmVar2->endFunction = local_7e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_7e8._40_8_;
    pmVar2->textDataFunction = local_7e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_7e8._24_8_;
    pmVar2->beginFunction = local_7e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_7e8._8_8_;
    local_8b8 = ColladaParserAutoGen14Private::_begin__title;
    local_8b0 = 0;
    local_8c8 = ColladaParserAutoGen14Private::_data__title;
    local_8c0 = 0;
    local_8d8 = ColladaParserAutoGen14Private::_end__title;
    uStack_8d0 = 0;
    local_8e8 = ColladaParserAutoGen14Private::_preBegin__title;
    uStack_8e0 = 0;
    local_8f8 = ColladaParserAutoGen14Private::_preEnd__title;
    uStack_8f0 = 0;
    local_908 = ColladaParserAutoGen14Private::_freeAttributes__title;
    uStack_900 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_8a8,0x850530,0,0x85d260,0,in_R9,0x850560);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_8a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_8a8._88_8_;
    pmVar2->validateEndFunction = local_8a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_8a8._72_8_;
    pmVar2->validateBeginFunction = local_8a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_8a8._56_8_;
    pmVar2->endFunction = local_8a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_8a8._40_8_;
    pmVar2->textDataFunction = local_8a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_8a8._24_8_;
    pmVar2->beginFunction = local_8a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_8a8._8_8_;
    local_978 = ColladaParserAutoGen14Private::_begin__unit;
    local_970 = 0;
    local_988 = ColladaParserAutoGen14Private::_data__unit;
    local_980 = 0;
    local_998 = ColladaParserAutoGen14Private::_end__unit;
    uStack_990 = 0;
    local_9a8 = ColladaParserAutoGen14Private::_preBegin__unit;
    uStack_9a0 = 0;
    local_9b8 = ColladaParserAutoGen14Private::_preEnd__unit;
    uStack_9b0 = 0;
    local_9c8 = ColladaParserAutoGen14Private::_freeAttributes__unit;
    uStack_9c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_968,0x850580,0,0x85d2e0,0,in_R9,0x8505b0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_968.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_968._88_8_;
    pmVar2->validateEndFunction = local_968.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_968._72_8_;
    pmVar2->validateBeginFunction = local_968.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_968._56_8_;
    pmVar2->endFunction = local_968.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_968._40_8_;
    pmVar2->textDataFunction = local_968.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_968._24_8_;
    pmVar2->beginFunction = local_968.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_968._8_8_;
    local_a38 = ColladaParserAutoGen14Private::_begin__up_axis;
    local_a30 = 0;
    local_a48 = ColladaParserAutoGen14Private::_data__up_axis;
    local_a40 = 0;
    local_a58 = ColladaParserAutoGen14Private::_end__up_axis;
    uStack_a50 = 0;
    local_a68 = ColladaParserAutoGen14Private::_preBegin__up_axis;
    uStack_a60 = 0;
    local_a78 = ColladaParserAutoGen14Private::_preEnd__up_axis;
    uStack_a70 = 0;
    local_a88 = ColladaParserAutoGen14Private::_freeAttributes__up_axis;
    uStack_a80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_a28,0x8505d0,0,0x85d4b0,0,in_R9,0x850600);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_a28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_a28._88_8_;
    pmVar2->validateEndFunction = local_a28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_a28._72_8_;
    pmVar2->validateBeginFunction = local_a28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_a28._56_8_;
    pmVar2->endFunction = local_a28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_a28._40_8_;
    pmVar2->textDataFunction = local_a28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_a28._24_8_;
    pmVar2->beginFunction = local_a28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_a28._8_8_;
    local_af8 = ColladaParserAutoGen14Private::_begin__author;
    local_af0 = 0;
    local_b08 = ColladaParserAutoGen14Private::_data__author;
    local_b00 = 0;
    local_b18 = ColladaParserAutoGen14Private::_end__author;
    uStack_b10 = 0;
    local_b28 = ColladaParserAutoGen14Private::_preBegin__author;
    uStack_b20 = 0;
    local_b38 = ColladaParserAutoGen14Private::_preEnd__author;
    uStack_b30 = 0;
    local_b48 = ColladaParserAutoGen14Private::_freeAttributes__author;
    uStack_b40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_ae8,0x850620,0,0x85cb00,0,in_R9,0x850650);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_ae8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ae8._88_8_;
    pmVar2->validateEndFunction = local_ae8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ae8._72_8_;
    pmVar2->validateBeginFunction = local_ae8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ae8._56_8_;
    pmVar2->endFunction = local_ae8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ae8._40_8_;
    pmVar2->textDataFunction = local_ae8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ae8._24_8_;
    pmVar2->beginFunction = local_ae8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ae8._8_8_;
    local_bb8 = ColladaParserAutoGen14Private::_begin__authoring_tool;
    local_bb0 = 0;
    local_bc8 = ColladaParserAutoGen14Private::_data__authoring_tool;
    local_bc0 = 0;
    local_bd8 = ColladaParserAutoGen14Private::_end__authoring_tool;
    uStack_bd0 = 0;
    local_be8 = ColladaParserAutoGen14Private::_preBegin__authoring_tool;
    uStack_be0 = 0;
    local_bf8 = ColladaParserAutoGen14Private::_preEnd__authoring_tool;
    uStack_bf0 = 0;
    local_c08 = ColladaParserAutoGen14Private::_freeAttributes__authoring_tool;
    uStack_c00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_ba8,0x850670,0,0x85cb80,0,in_R9,0x8506a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_ba8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ba8._88_8_;
    pmVar2->validateEndFunction = local_ba8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ba8._72_8_;
    pmVar2->validateBeginFunction = local_ba8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ba8._56_8_;
    pmVar2->endFunction = local_ba8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ba8._40_8_;
    pmVar2->textDataFunction = local_ba8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ba8._24_8_;
    pmVar2->beginFunction = local_ba8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ba8._8_8_;
    local_c78 = ColladaParserAutoGen14Private::_begin__comments;
    local_c70 = 0;
    local_c88 = ColladaParserAutoGen14Private::_data__comments;
    local_c80 = 0;
    local_c98 = ColladaParserAutoGen14Private::_end__comments;
    uStack_c90 = 0;
    local_ca8 = ColladaParserAutoGen14Private::_preBegin__comments;
    uStack_ca0 = 0;
    local_cb8 = ColladaParserAutoGen14Private::_preEnd__comments;
    uStack_cb0 = 0;
    local_cc8 = ColladaParserAutoGen14Private::_freeAttributes__comments;
    uStack_cc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_c68,0x8506c0,0,0x85cc00,0,in_R9,0x8506f0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_c68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_c68._88_8_;
    pmVar2->validateEndFunction = local_c68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_c68._72_8_;
    pmVar2->validateBeginFunction = local_c68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_c68._56_8_;
    pmVar2->endFunction = local_c68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_c68._40_8_;
    pmVar2->textDataFunction = local_c68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_c68._24_8_;
    pmVar2->beginFunction = local_c68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_c68._8_8_;
    local_d38 = ColladaParserAutoGen14Private::_begin__copyright;
    local_d30 = 0;
    local_d48 = ColladaParserAutoGen14Private::_data__copyright;
    local_d40 = 0;
    local_d58 = ColladaParserAutoGen14Private::_end__copyright;
    uStack_d50 = 0;
    local_d68 = ColladaParserAutoGen14Private::_preBegin__copyright;
    uStack_d60 = 0;
    local_d78 = ColladaParserAutoGen14Private::_preEnd__copyright;
    uStack_d70 = 0;
    local_d88 = ColladaParserAutoGen14Private::_freeAttributes__copyright;
    uStack_d80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_d28,0x850710,0,0x85cc80,0,in_R9,0x850740);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_d28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_d28._88_8_;
    pmVar2->validateEndFunction = local_d28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_d28._72_8_;
    pmVar2->validateBeginFunction = local_d28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_d28._56_8_;
    pmVar2->endFunction = local_d28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_d28._40_8_;
    pmVar2->textDataFunction = local_d28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_d28._24_8_;
    pmVar2->beginFunction = local_d28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_d28._8_8_;
    local_df8 = ColladaParserAutoGen14Private::_begin__source_data;
    local_df0 = 0;
    local_e08 = ColladaParserAutoGen14Private::_data__source_data;
    local_e00 = 0;
    local_e18 = ColladaParserAutoGen14Private::_end__source_data;
    uStack_e10 = 0;
    local_e28 = ColladaParserAutoGen14Private::_preBegin__source_data;
    uStack_e20 = 0;
    local_e38 = ColladaParserAutoGen14Private::_preEnd__source_data;
    uStack_e30 = 0;
    local_e48 = ColladaParserAutoGen14Private::_freeAttributes__source_data;
    uStack_e40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_de8,0x850760,0,0x85cd00,0,in_R9,0x850790);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_de8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_de8._88_8_;
    pmVar2->validateEndFunction = local_de8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_de8._72_8_;
    pmVar2->validateBeginFunction = local_de8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_de8._56_8_;
    pmVar2->endFunction = local_de8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_de8._40_8_;
    pmVar2->textDataFunction = local_de8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_de8._24_8_;
    pmVar2->beginFunction = local_de8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_de8._8_8_;
    local_eb8 = ColladaParserAutoGen14Private::_begin__technique;
    local_eb0 = 0;
    local_ec8 = ColladaParserAutoGen14Private::_data__technique;
    local_ec0 = 0;
    local_ed8 = ColladaParserAutoGen14Private::_end__technique;
    uStack_ed0 = 0;
    local_ee8 = ColladaParserAutoGen14Private::_preBegin__technique;
    uStack_ee0 = 0;
    local_ef8 = ColladaParserAutoGen14Private::_preEnd__technique;
    uStack_ef0 = 0;
    local_f08 = ColladaParserAutoGen14Private::_freeAttributes__technique;
    uStack_f00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_ea8,0x8507b0,0,0x85f410,0,in_R9,0x8507e0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_ea8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ea8._88_8_;
    pmVar2->validateEndFunction = local_ea8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ea8._72_8_;
    pmVar2->validateBeginFunction = local_ea8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ea8._56_8_;
    pmVar2->endFunction = local_ea8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ea8._40_8_;
    pmVar2->textDataFunction = local_ea8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ea8._24_8_;
    pmVar2->beginFunction = local_ea8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ea8._8_8_;
    local_f78 = ColladaParserAutoGen14Private::_begin__instance_physics_model;
    local_f70 = 0;
    local_f88 = ColladaParserAutoGen14Private::_data__instance_physics_model;
    local_f80 = 0;
    local_f98 = ColladaParserAutoGen14Private::_end__instance_physics_model;
    uStack_f90 = 0;
    local_fa8 = ColladaParserAutoGen14Private::_preBegin__instance_physics_model;
    uStack_fa0 = 0;
    local_fb8 = ColladaParserAutoGen14Private::_preEnd__instance_physics_model;
    uStack_fb0 = 0;
    local_fc8 = ColladaParserAutoGen14Private::_freeAttributes__instance_physics_model;
    uStack_fc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_f68,0x84ec30,0,0x876b40,0,in_R9,0x84ec60);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_f68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_f68._88_8_;
    pmVar2->validateEndFunction = local_f68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_f68._72_8_;
    pmVar2->validateBeginFunction = local_f68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_f68._56_8_;
    pmVar2->endFunction = local_f68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_f68._40_8_;
    pmVar2->textDataFunction = local_f68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_f68._24_8_;
    pmVar2->beginFunction = local_f68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_f68._8_8_;
    local_1038 = ColladaParserAutoGen14Private::_begin__rigid_body;
    local_1030 = 0;
    local_1048 = ColladaParserAutoGen14Private::_data__rigid_body;
    local_1040 = 0;
    local_1058 = ColladaParserAutoGen14Private::_end__rigid_body;
    uStack_1050 = 0;
    local_1068 = ColladaParserAutoGen14Private::_preBegin__rigid_body;
    uStack_1060 = 0;
    local_1078 = ColladaParserAutoGen14Private::_preEnd__rigid_body;
    uStack_1070 = 0;
    local_1088 = ColladaParserAutoGen14Private::_freeAttributes__rigid_body;
    uStack_1080 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1028,0x84f5e0,0,0x872e10,0,in_R9,0x84f610);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1028.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1028._88_8_;
    pmVar2->validateEndFunction = local_1028.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1028._72_8_;
    pmVar2->validateBeginFunction = local_1028.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1028._56_8_;
    pmVar2->endFunction = local_1028.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1028._40_8_;
    pmVar2->textDataFunction = local_1028.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1028._24_8_;
    pmVar2->beginFunction = local_1028.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1028._8_8_;
    local_10f8 = ColladaParserAutoGen14Private::_begin__rigid_constraint;
    local_10f0 = 0;
    local_1108 = ColladaParserAutoGen14Private::_data__rigid_constraint;
    local_1100 = 0;
    local_1118 = ColladaParserAutoGen14Private::_end__rigid_constraint;
    uStack_1110 = 0;
    local_1128 = ColladaParserAutoGen14Private::_preBegin__rigid_constraint;
    uStack_1120 = 0;
    local_1138 = ColladaParserAutoGen14Private::_preEnd__rigid_constraint;
    uStack_1130 = 0;
    local_1148 = ColladaParserAutoGen14Private::_freeAttributes__rigid_constraint;
    uStack_1140 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_10e8,0x84f630,0,0x874d90,0,in_R9,0x84f660);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_10e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_10e8._88_8_;
    pmVar2->validateEndFunction = local_10e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_10e8._72_8_;
    pmVar2->validateBeginFunction = local_10e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_10e8._56_8_;
    pmVar2->endFunction = local_10e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_10e8._40_8_;
    pmVar2->textDataFunction = local_10e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_10e8._24_8_;
    pmVar2->beginFunction = local_10e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_10e8._8_8_;
    local_11b8 = ColladaParserAutoGen14Private::_begin__instance_force_field;
    local_11b0 = 0;
    local_11c8 = ColladaParserAutoGen14Private::_data__instance_force_field;
    local_11c0 = 0;
    local_11d8 = ColladaParserAutoGen14Private::_end__instance_force_field;
    uStack_11d0 = 0;
    local_11e8 = ColladaParserAutoGen14Private::_preBegin__instance_force_field;
    uStack_11e0 = 0;
    local_11f8 = ColladaParserAutoGen14Private::_preEnd__instance_force_field;
    uStack_11f0 = 0;
    local_1208 = ColladaParserAutoGen14Private::_freeAttributes__instance_force_field;
    uStack_1200 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_11a8,0x84ea50,0,0x877050,0,in_R9,0x84ea80);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_11a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_11a8._88_8_;
    pmVar2->validateEndFunction = local_11a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_11a8._72_8_;
    pmVar2->validateBeginFunction = local_11a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_11a8._56_8_;
    pmVar2->endFunction = local_11a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_11a8._40_8_;
    pmVar2->textDataFunction = local_11a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_11a8._24_8_;
    pmVar2->beginFunction = local_11a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_11a8._8_8_;
    local_1278 = ColladaParserAutoGen14Private::_begin__instance_rigid_body;
    local_1270 = 0;
    local_1288 = ColladaParserAutoGen14Private::_data__instance_rigid_body;
    local_1280 = 0;
    local_1298 = ColladaParserAutoGen14Private::_end__instance_rigid_body;
    uStack_1290 = 0;
    local_12a8 = ColladaParserAutoGen14Private::_preBegin__instance_rigid_body;
    uStack_12a0 = 0;
    local_12b8 = ColladaParserAutoGen14Private::_preEnd__instance_rigid_body;
    uStack_12b0 = 0;
    local_12c8 = ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body;
    uStack_12c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1268,0x84ecd0,0,0x877400,0,in_R9,0x84ed00);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1268.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1268._88_8_;
    pmVar2->validateEndFunction = local_1268.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1268._72_8_;
    pmVar2->validateBeginFunction = local_1268.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1268._56_8_;
    pmVar2->endFunction = local_1268.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1268._40_8_;
    pmVar2->textDataFunction = local_1268.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1268._24_8_;
    pmVar2->beginFunction = local_1268.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1268._8_8_;
    local_1338 = ColladaParserAutoGen14Private::_begin__instance_rigid_constraint;
    local_1330 = 0;
    local_1348 = ColladaParserAutoGen14Private::_data__instance_rigid_constraint;
    local_1340 = 0;
    local_1358 = ColladaParserAutoGen14Private::_end__instance_rigid_constraint;
    uStack_1350 = 0;
    local_1368 = ColladaParserAutoGen14Private::_preBegin__instance_rigid_constraint;
    uStack_1360 = 0;
    local_1378 = ColladaParserAutoGen14Private::_preEnd__instance_rigid_constraint;
    uStack_1370 = 0;
    local_1388 = ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_constraint;
    uStack_1380 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1328,0x84ed20,0,0x8780f0,0,in_R9,0x84ed50);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1328.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1328._88_8_;
    pmVar2->validateEndFunction = local_1328.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1328._72_8_;
    pmVar2->validateBeginFunction = local_1328.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1328._56_8_;
    pmVar2->endFunction = local_1328.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1328._40_8_;
    pmVar2->textDataFunction = local_1328.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1328._24_8_;
    pmVar2->beginFunction = local_1328.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1328._8_8_;
    local_13f8 = ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common;
    local_13f0 = 0;
    local_1408 = ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common;
    local_1400 = 0;
    local_1418 = ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common;
    uStack_1410 = 0;
    local_1428 = ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common;
    uStack_1420 = 0;
    local_1438 = ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common;
    uStack_1430 = 0;
    local_1448 = ColladaParserAutoGen14Private::
                 _freeAttributes__instance_rigid_body__technique_common;
    uStack_1440 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_13e8,0x84fcc0,0,0x877810,0,in_R9,0x84fcf0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_13e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_13e8._88_8_;
    pmVar2->validateEndFunction = local_13e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_13e8._72_8_;
    pmVar2->validateBeginFunction = local_13e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_13e8._56_8_;
    pmVar2->endFunction = local_13e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_13e8._40_8_;
    pmVar2->textDataFunction = local_13e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_13e8._24_8_;
    pmVar2->beginFunction = local_13e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_13e8._8_8_;
    local_14b8 = ColladaParserAutoGen14Private::_begin__angular_velocity;
    local_14b0 = 0;
    local_14c8 = ColladaParserAutoGen14Private::_data__angular_velocity;
    local_14c0 = 0;
    local_14d8 = ColladaParserAutoGen14Private::_end__angular_velocity;
    uStack_14d0 = 0;
    local_14e8 = ColladaParserAutoGen14Private::_preBegin__angular_velocity;
    uStack_14e0 = 0;
    local_14f8 = ColladaParserAutoGen14Private::_preEnd__angular_velocity;
    uStack_14f0 = 0;
    local_1508 = ColladaParserAutoGen14Private::_freeAttributes__angular_velocity;
    uStack_1500 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_14a8,0x85b160,0,0x877870,0,in_R9,0x85b190);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_14a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_14a8._88_8_;
    pmVar2->validateEndFunction = local_14a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_14a8._72_8_;
    pmVar2->validateBeginFunction = local_14a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_14a8._56_8_;
    pmVar2->endFunction = local_14a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_14a8._40_8_;
    pmVar2->textDataFunction = local_14a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_14a8._24_8_;
    pmVar2->beginFunction = local_14a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_14a8._8_8_;
    local_1578 = ColladaParserAutoGen14Private::
                 _begin__instance_rigid_body__technique_common__dynamic;
    local_1570 = 0;
    local_1588 = ColladaParserAutoGen14Private::
                 _data__instance_rigid_body__technique_common__dynamic;
    local_1580 = 0;
    local_1598 = ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__dynamic
    ;
    uStack_1590 = 0;
    local_15a8 = ColladaParserAutoGen14Private::
                 _preBegin__instance_rigid_body__technique_common__dynamic;
    uStack_15a0 = 0;
    local_15b8 = ColladaParserAutoGen14Private::
                 _preEnd__instance_rigid_body__technique_common__dynamic;
    uStack_15b0 = 0;
    local_15c8 = ColladaParserAutoGen14Private::
                 _freeAttributes__instance_rigid_body__technique_common__dynamic;
    uStack_15c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1568,0x85b1b0,0,0x8779f0,0,in_R9,0x85b1e0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1568.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1568._88_8_;
    pmVar2->validateEndFunction = local_1568.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1568._72_8_;
    pmVar2->validateBeginFunction = local_1568.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1568._56_8_;
    pmVar2->endFunction = local_1568.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1568._40_8_;
    pmVar2->textDataFunction = local_1568.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1568._24_8_;
    pmVar2->beginFunction = local_1568.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1568._8_8_;
    local_1638 = ColladaParserAutoGen14Private::_begin__inertia;
    local_1630 = 0;
    local_1648 = ColladaParserAutoGen14Private::_data__inertia;
    local_1640 = 0;
    local_1658 = ColladaParserAutoGen14Private::_end__inertia;
    uStack_1650 = 0;
    local_1668 = ColladaParserAutoGen14Private::_preBegin__inertia;
    uStack_1660 = 0;
    local_1678 = ColladaParserAutoGen14Private::_preEnd__inertia;
    uStack_1670 = 0;
    local_1688 = ColladaParserAutoGen14Private::_freeAttributes__inertia;
    uStack_1680 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1628,0x85b200,0,0x8736e0,0,in_R9,0x85b230);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1628.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1628._88_8_;
    pmVar2->validateEndFunction = local_1628.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1628._72_8_;
    pmVar2->validateBeginFunction = local_1628.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1628._56_8_;
    pmVar2->endFunction = local_1628.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1628._40_8_;
    pmVar2->textDataFunction = local_1628.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1628._24_8_;
    pmVar2->beginFunction = local_1628.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1628._8_8_;
    local_16f8 = ColladaParserAutoGen14Private::_begin__instance_physics_material;
    local_16f0 = 0;
    local_1708 = ColladaParserAutoGen14Private::_data__instance_physics_material;
    local_1700 = 0;
    local_1718 = ColladaParserAutoGen14Private::_end__instance_physics_material;
    uStack_1710 = 0;
    local_1728 = ColladaParserAutoGen14Private::_preBegin__instance_physics_material;
    uStack_1720 = 0;
    local_1738 = ColladaParserAutoGen14Private::_preEnd__instance_physics_material;
    uStack_1730 = 0;
    local_1748 = ColladaParserAutoGen14Private::_freeAttributes__instance_physics_material;
    uStack_1740 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_16e8,0x84ebe0,0,0x8738a0,0,in_R9,0x84ec10);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_16e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_16e8._88_8_;
    pmVar2->validateEndFunction = local_16e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_16e8._72_8_;
    pmVar2->validateBeginFunction = local_16e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_16e8._56_8_;
    pmVar2->endFunction = local_16e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_16e8._40_8_;
    pmVar2->textDataFunction = local_16e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_16e8._24_8_;
    pmVar2->beginFunction = local_16e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_16e8._8_8_;
    local_17b8 = ColladaParserAutoGen14Private::_begin__mass;
    local_17b0 = 0;
    local_17c8 = ColladaParserAutoGen14Private::_data__mass;
    local_17c0 = 0;
    local_17d8 = ColladaParserAutoGen14Private::_end__mass;
    uStack_17d0 = 0;
    local_17e8 = ColladaParserAutoGen14Private::_preBegin__mass;
    uStack_17e0 = 0;
    local_17f8 = ColladaParserAutoGen14Private::_preEnd__mass;
    uStack_17f0 = 0;
    local_1808 = ColladaParserAutoGen14Private::_freeAttributes__mass;
    uStack_1800 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_17a8,0x85b250,0,0x873360,0,in_R9,0x85b280);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_17a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_17a8._88_8_;
    pmVar2->validateEndFunction = local_17a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_17a8._72_8_;
    pmVar2->validateBeginFunction = local_17a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_17a8._56_8_;
    pmVar2->endFunction = local_17a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_17a8._40_8_;
    pmVar2->textDataFunction = local_17a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_17a8._24_8_;
    pmVar2->beginFunction = local_17a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_17a8._8_8_;
    local_1878 = ColladaParserAutoGen14Private::
                 _begin__instance_rigid_body__technique_common__mass_frame;
    local_1870 = 0;
    local_1888 = ColladaParserAutoGen14Private::
                 _data__instance_rigid_body__technique_common__mass_frame;
    local_1880 = 0;
    local_1898 = ColladaParserAutoGen14Private::
                 _end__instance_rigid_body__technique_common__mass_frame;
    uStack_1890 = 0;
    local_18a8 = ColladaParserAutoGen14Private::
                 _preBegin__instance_rigid_body__technique_common__mass_frame;
    uStack_18a0 = 0;
    local_18b8 = ColladaParserAutoGen14Private::
                 _preEnd__instance_rigid_body__technique_common__mass_frame;
    uStack_18b0 = 0;
    local_18c8 = ColladaParserAutoGen14Private::
                 _freeAttributes__instance_rigid_body__technique_common__mass_frame;
    uStack_18c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1868,0x85b2a0,0,0x877d10,0,in_R9,0x85b2d0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1868.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1868._88_8_;
    pmVar2->validateEndFunction = local_1868.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1868._72_8_;
    pmVar2->validateBeginFunction = local_1868.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1868._56_8_;
    pmVar2->endFunction = local_1868.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1868._40_8_;
    pmVar2->textDataFunction = local_1868.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1868._24_8_;
    pmVar2->beginFunction = local_1868.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1868._8_8_;
    local_1938 = ColladaParserAutoGen14Private::_begin__physics_material;
    local_1930 = 0;
    local_1948 = ColladaParserAutoGen14Private::_data__physics_material;
    local_1940 = 0;
    local_1958 = ColladaParserAutoGen14Private::_end__physics_material;
    uStack_1950 = 0;
    local_1968 = ColladaParserAutoGen14Private::_preBegin__physics_material;
    uStack_1960 = 0;
    local_1978 = ColladaParserAutoGen14Private::_preEnd__physics_material;
    uStack_1970 = 0;
    local_1988 = ColladaParserAutoGen14Private::_freeAttributes__physics_material;
    uStack_1980 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1928,0x84f1d0,0,0x871fa0,0,in_R9,0x84f200);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1928.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1928._88_8_;
    pmVar2->validateEndFunction = local_1928.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1928._72_8_;
    pmVar2->validateBeginFunction = local_1928.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1928._56_8_;
    pmVar2->endFunction = local_1928.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1928._40_8_;
    pmVar2->textDataFunction = local_1928.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1928._24_8_;
    pmVar2->beginFunction = local_1928.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1928._8_8_;
    local_19f8 = ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__shape
    ;
    local_19f0 = 0;
    local_1a08 = ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__shape;
    local_1a00 = 0;
    local_1a18 = ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__shape;
    uStack_1a10 = 0;
    local_1a28 = ColladaParserAutoGen14Private::
                 _preBegin__instance_rigid_body__technique_common__shape;
    uStack_1a20 = 0;
    local_1a38 = ColladaParserAutoGen14Private::
                 _preEnd__instance_rigid_body__technique_common__shape;
    uStack_1a30 = 0;
    local_1a48 = ColladaParserAutoGen14Private::
                 _freeAttributes__instance_rigid_body__technique_common__shape;
    uStack_1a40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_19e8,0x84f950,0,0x877d70,0,in_R9,0x84f980);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_19e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_19e8._88_8_;
    pmVar2->validateEndFunction = local_19e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_19e8._72_8_;
    pmVar2->validateBeginFunction = local_19e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_19e8._56_8_;
    pmVar2->endFunction = local_19e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_19e8._40_8_;
    pmVar2->textDataFunction = local_19e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_19e8._24_8_;
    pmVar2->beginFunction = local_19e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_19e8._8_8_;
    local_1ab8 = ColladaParserAutoGen14Private::_begin__velocity;
    local_1ab0 = 0;
    local_1ac8 = ColladaParserAutoGen14Private::_data__velocity;
    local_1ac0 = 0;
    local_1ad8 = ColladaParserAutoGen14Private::_end__velocity;
    uStack_1ad0 = 0;
    local_1ae8 = ColladaParserAutoGen14Private::_preBegin__velocity;
    uStack_1ae0 = 0;
    local_1af8 = ColladaParserAutoGen14Private::_preEnd__velocity;
    uStack_1af0 = 0;
    local_1b08 = ColladaParserAutoGen14Private::_freeAttributes__velocity;
    uStack_1b00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1aa8,0x85b2f0,0,0x877930,0,in_R9,0x85b320);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1aa8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1aa8._88_8_;
    pmVar2->validateEndFunction = local_1aa8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1aa8._72_8_;
    pmVar2->validateBeginFunction = local_1aa8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1aa8._56_8_;
    pmVar2->endFunction = local_1aa8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1aa8._40_8_;
    pmVar2->textDataFunction = local_1aa8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1aa8._24_8_;
    pmVar2->beginFunction = local_1aa8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1aa8._8_8_;
    local_1b78 = ColladaParserAutoGen14Private::_begin__rotate;
    local_1b70 = 0;
    local_1b88 = ColladaParserAutoGen14Private::_data__rotate;
    local_1b80 = 0;
    local_1b98 = ColladaParserAutoGen14Private::_end__rotate;
    uStack_1b90 = 0;
    local_1ba8 = ColladaParserAutoGen14Private::_preBegin__rotate;
    uStack_1ba0 = 0;
    local_1bb8 = ColladaParserAutoGen14Private::_preEnd__rotate;
    uStack_1bb0 = 0;
    local_1bc8 = ColladaParserAutoGen14Private::_freeAttributes__rotate;
    uStack_1bc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1b68,0x85ada0,0,0x86f840,0,in_R9,0x85add0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1b68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1b68._88_8_;
    pmVar2->validateEndFunction = local_1b68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1b68._72_8_;
    pmVar2->validateBeginFunction = local_1b68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1b68._56_8_;
    pmVar2->endFunction = local_1b68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1b68._40_8_;
    pmVar2->textDataFunction = local_1b68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1b68._24_8_;
    pmVar2->beginFunction = local_1b68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1b68._8_8_;
    local_1c38 = ColladaParserAutoGen14Private::_begin__translate;
    local_1c30 = 0;
    local_1c48 = ColladaParserAutoGen14Private::_data__translate;
    local_1c40 = 0;
    local_1c58 = ColladaParserAutoGen14Private::_end__translate;
    uStack_1c50 = 0;
    local_1c68 = ColladaParserAutoGen14Private::_preBegin__translate;
    uStack_1c60 = 0;
    local_1c78 = ColladaParserAutoGen14Private::_preEnd__translate;
    uStack_1c70 = 0;
    local_1c88 = ColladaParserAutoGen14Private::_freeAttributes__translate;
    uStack_1c80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1c28,0x85ae90,0,0x86fd80,0,in_R9,0x85aec0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1c28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1c28._88_8_;
    pmVar2->validateEndFunction = local_1c28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1c28._72_8_;
    pmVar2->validateBeginFunction = local_1c28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1c28._56_8_;
    pmVar2->endFunction = local_1c28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1c28._40_8_;
    pmVar2->textDataFunction = local_1c28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1c28._24_8_;
    pmVar2->beginFunction = local_1c28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1c28._8_8_;
    local_1cf8 = ColladaParserAutoGen14Private::_begin__physics_material__technique_common;
    local_1cf0 = 0;
    local_1d08 = ColladaParserAutoGen14Private::_data__physics_material__technique_common;
    local_1d00 = 0;
    local_1d18 = ColladaParserAutoGen14Private::_end__physics_material__technique_common;
    uStack_1d10 = 0;
    local_1d28 = ColladaParserAutoGen14Private::_preBegin__physics_material__technique_common;
    uStack_1d20 = 0;
    local_1d38 = ColladaParserAutoGen14Private::_preEnd__physics_material__technique_common;
    uStack_1d30 = 0;
    local_1d48 = ColladaParserAutoGen14Private::_freeAttributes__physics_material__technique_common;
    uStack_1d40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1ce8,0x85b020,0,0x872130,0,in_R9,0x85b050);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1ce8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1ce8._88_8_;
    pmVar2->validateEndFunction = local_1ce8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1ce8._72_8_;
    pmVar2->validateBeginFunction = local_1ce8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1ce8._56_8_;
    pmVar2->endFunction = local_1ce8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1ce8._40_8_;
    pmVar2->textDataFunction = local_1ce8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1ce8._24_8_;
    pmVar2->beginFunction = local_1ce8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1ce8._8_8_;
    local_1db8 = ColladaParserAutoGen14Private::_begin__dynamic_friction;
    local_1db0 = 0;
    local_1dc8 = ColladaParserAutoGen14Private::_data__dynamic_friction;
    local_1dc0 = 0;
    local_1dd8 = ColladaParserAutoGen14Private::_end__dynamic_friction;
    uStack_1dd0 = 0;
    local_1de8 = ColladaParserAutoGen14Private::_preBegin__dynamic_friction;
    uStack_1de0 = 0;
    local_1df8 = ColladaParserAutoGen14Private::_preEnd__dynamic_friction;
    uStack_1df0 = 0;
    local_1e08 = ColladaParserAutoGen14Private::_freeAttributes__dynamic_friction;
    uStack_1e00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1da8,0x85b070,0,0x872190,0,in_R9,0x85b0a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1da8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1da8._88_8_;
    pmVar2->validateEndFunction = local_1da8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1da8._72_8_;
    pmVar2->validateBeginFunction = local_1da8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1da8._56_8_;
    pmVar2->endFunction = local_1da8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1da8._40_8_;
    pmVar2->textDataFunction = local_1da8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1da8._24_8_;
    pmVar2->beginFunction = local_1da8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1da8._8_8_;
    local_1e78 = ColladaParserAutoGen14Private::_begin__restitution;
    local_1e70 = 0;
    local_1e88 = ColladaParserAutoGen14Private::_data__restitution;
    local_1e80 = 0;
    local_1e98 = ColladaParserAutoGen14Private::_end__restitution;
    uStack_1e90 = 0;
    local_1ea8 = ColladaParserAutoGen14Private::_preBegin__restitution;
    uStack_1ea0 = 0;
    local_1eb8 = ColladaParserAutoGen14Private::_preEnd__restitution;
    uStack_1eb0 = 0;
    local_1ec8 = ColladaParserAutoGen14Private::_freeAttributes__restitution;
    uStack_1ec0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1e68,0x85b0c0,0,0x8724b0,0,in_R9,0x85b0f0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1e68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1e68._88_8_;
    pmVar2->validateEndFunction = local_1e68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1e68._72_8_;
    pmVar2->validateBeginFunction = local_1e68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1e68._56_8_;
    pmVar2->endFunction = local_1e68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1e68._40_8_;
    pmVar2->textDataFunction = local_1e68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1e68._24_8_;
    pmVar2->beginFunction = local_1e68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1e68._8_8_;
    local_1f38 = ColladaParserAutoGen14Private::_begin__static_friction;
    local_1f30 = 0;
    local_1f48 = ColladaParserAutoGen14Private::_data__static_friction;
    local_1f40 = 0;
    local_1f58 = ColladaParserAutoGen14Private::_end__static_friction;
    uStack_1f50 = 0;
    local_1f68 = ColladaParserAutoGen14Private::_preBegin__static_friction;
    uStack_1f60 = 0;
    local_1f78 = ColladaParserAutoGen14Private::_preEnd__static_friction;
    uStack_1f70 = 0;
    local_1f88 = ColladaParserAutoGen14Private::_freeAttributes__static_friction;
    uStack_1f80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1f28,0x85b110,0,0x8727d0,0,in_R9,0x85b140);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1f28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1f28._88_8_;
    pmVar2->validateEndFunction = local_1f28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1f28._72_8_;
    pmVar2->validateBeginFunction = local_1f28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1f28._56_8_;
    pmVar2->endFunction = local_1f28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1f28._40_8_;
    pmVar2->textDataFunction = local_1f28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1f28._24_8_;
    pmVar2->beginFunction = local_1f28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1f28._8_8_;
    local_1ff8 = ColladaParserAutoGen14Private::_begin__box;
    local_1ff0 = 0;
    local_2008 = ColladaParserAutoGen14Private::_data__box;
    local_2000 = 0;
    local_2018 = ColladaParserAutoGen14Private::_end__box;
    uStack_2010 = 0;
    local_2028 = ColladaParserAutoGen14Private::_preBegin__box;
    uStack_2020 = 0;
    local_2038 = ColladaParserAutoGen14Private::_preEnd__box;
    uStack_2030 = 0;
    local_2048 = ColladaParserAutoGen14Private::_freeAttributes__box;
    uStack_2040 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1fe8,0x84e370,0,0x874410,0,in_R9,0x84e3a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_1fe8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1fe8._88_8_;
    pmVar2->validateEndFunction = local_1fe8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1fe8._72_8_;
    pmVar2->validateBeginFunction = local_1fe8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1fe8._56_8_;
    pmVar2->endFunction = local_1fe8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1fe8._40_8_;
    pmVar2->textDataFunction = local_1fe8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1fe8._24_8_;
    pmVar2->beginFunction = local_1fe8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1fe8._8_8_;
    local_20b8 = ColladaParserAutoGen14Private::_begin__capsule;
    local_20b0 = 0;
    local_20c8 = ColladaParserAutoGen14Private::_data__capsule;
    local_20c0 = 0;
    local_20d8 = ColladaParserAutoGen14Private::_end__capsule;
    uStack_20d0 = 0;
    local_20e8 = ColladaParserAutoGen14Private::_preBegin__capsule;
    uStack_20e0 = 0;
    local_20f8 = ColladaParserAutoGen14Private::_preEnd__capsule;
    uStack_20f0 = 0;
    local_2108 = ColladaParserAutoGen14Private::_freeAttributes__capsule;
    uStack_2100 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_20a8,0x84e410,0,0x874cd0,0,in_R9,0x84e440);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_20a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_20a8._88_8_;
    pmVar2->validateEndFunction = local_20a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_20a8._72_8_;
    pmVar2->validateBeginFunction = local_20a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_20a8._56_8_;
    pmVar2->endFunction = local_20a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_20a8._40_8_;
    pmVar2->textDataFunction = local_20a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_20a8._24_8_;
    pmVar2->beginFunction = local_20a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_20a8._8_8_;
    local_2178 = ColladaParserAutoGen14Private::_begin__cylinder;
    local_2170 = 0;
    local_2188 = ColladaParserAutoGen14Private::_data__cylinder;
    local_2180 = 0;
    local_2198 = ColladaParserAutoGen14Private::_end__cylinder;
    uStack_2190 = 0;
    local_21a8 = ColladaParserAutoGen14Private::_preBegin__cylinder;
    uStack_21a0 = 0;
    local_21b8 = ColladaParserAutoGen14Private::_preEnd__cylinder;
    uStack_21b0 = 0;
    local_21c8 = ColladaParserAutoGen14Private::_freeAttributes__cylinder;
    uStack_21c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_2168,0x84e5a0,0,0x8747b0,0,in_R9,0x84e5d0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_2168.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2168._88_8_;
    pmVar2->validateEndFunction = local_2168.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2168._72_8_;
    pmVar2->validateBeginFunction = local_2168.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2168._56_8_;
    pmVar2->endFunction = local_2168.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2168._40_8_;
    pmVar2->textDataFunction = local_2168.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2168._24_8_;
    pmVar2->beginFunction = local_2168.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2168._8_8_;
    local_2238 = ColladaParserAutoGen14Private::_begin__density;
    local_2230 = 0;
    local_2248 = ColladaParserAutoGen14Private::_data__density;
    local_2240 = 0;
    local_2258 = ColladaParserAutoGen14Private::_end__density;
    uStack_2250 = 0;
    local_2268 = ColladaParserAutoGen14Private::_preBegin__density;
    uStack_2260 = 0;
    local_2278 = ColladaParserAutoGen14Private::_preEnd__density;
    uStack_2270 = 0;
    local_2288 = ColladaParserAutoGen14Private::_freeAttributes__density;
    uStack_2280 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_2228,0x85b340,0,0x873fd0,0,in_R9,0x85b370);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_2228.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2228._88_8_;
    pmVar2->validateEndFunction = local_2228.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2228._72_8_;
    pmVar2->validateBeginFunction = local_2228.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2228._56_8_;
    pmVar2->endFunction = local_2228.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2228._40_8_;
    pmVar2->textDataFunction = local_2228.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2228._24_8_;
    pmVar2->beginFunction = local_2228.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2228._8_8_;
    local_22f8 = ColladaParserAutoGen14Private::
                 _begin__instance_rigid_body__technique_common__shape__hollow;
    local_22f0 = 0;
    local_2308 = ColladaParserAutoGen14Private::
                 _data__instance_rigid_body__technique_common__shape__hollow;
    local_2300 = 0;
    local_2318 = ColladaParserAutoGen14Private::
                 _end__instance_rigid_body__technique_common__shape__hollow;
    uStack_2310 = 0;
    local_2328 = ColladaParserAutoGen14Private::
                 _preBegin__instance_rigid_body__technique_common__shape__hollow;
    uStack_2320 = 0;
    local_2338 = ColladaParserAutoGen14Private::
                 _preEnd__instance_rigid_body__technique_common__shape__hollow;
    uStack_2330 = 0;
    local_2348 = ColladaParserAutoGen14Private::
                 _freeAttributes__instance_rigid_body__technique_common__shape__hollow;
    uStack_2340 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_22e8,0x85b390,0,0x877dd0,0,in_R9,0x85b3c0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_22e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_22e8._88_8_;
    pmVar2->validateEndFunction = local_22e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_22e8._72_8_;
    pmVar2->validateBeginFunction = local_22e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_22e8._56_8_;
    pmVar2->endFunction = local_22e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_22e8._40_8_;
    pmVar2->textDataFunction = local_22e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_22e8._24_8_;
    pmVar2->beginFunction = local_22e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_22e8._8_8_;
    local_23b8 = ColladaParserAutoGen14Private::_begin__instance_geometry;
    local_23b0 = 0;
    local_23c8 = ColladaParserAutoGen14Private::_data__instance_geometry;
    local_23c0 = 0;
    local_23d8 = ColladaParserAutoGen14Private::_end__instance_geometry;
    uStack_23d0 = 0;
    local_23e8 = ColladaParserAutoGen14Private::_preBegin__instance_geometry;
    uStack_23e0 = 0;
    local_23f8 = ColladaParserAutoGen14Private::_preEnd__instance_geometry;
    uStack_23f0 = 0;
    local_2408 = ColladaParserAutoGen14Private::_freeAttributes__instance_geometry;
    uStack_2400 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_23a8,0x84eaa0,0,0x871300,0,in_R9,0x84ead0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pcVar3 = ColladaParserAutoGen14Private::_preBegin__mass;
    pmVar2->freeAttributesFunction = local_23a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_23a8._88_8_;
    pmVar2->validateEndFunction = local_23a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_23a8._72_8_;
    pmVar2->validateBeginFunction = local_23a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_23a8._56_8_;
    pmVar2->endFunction = local_23a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_23a8._40_8_;
    pmVar2->textDataFunction = local_23a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_23a8._24_8_;
    pmVar2->beginFunction = local_23a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_23a8._8_8_;
    local_2478 = ColladaParserAutoGen14Private::_begin__mass;
    local_2470 = 0;
    local_2488 = ColladaParserAutoGen14Private::_data__mass;
    local_2480 = 0;
    local_2498 = ColladaParserAutoGen14Private::_end__mass;
    uStack_2490 = 0;
    local_24a8 = ColladaParserAutoGen14Private::_preBegin__mass;
    uStack_24a0 = 0;
    local_24b8 = ColladaParserAutoGen14Private::_preEnd__mass;
    uStack_24b0 = 0;
    local_24c8 = ColladaParserAutoGen14Private::_freeAttributes__mass;
    uStack_24c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_2468,0x85b250,0,0x873360,0,0x873470,0x85b280);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_2468.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2468._88_8_;
    pmVar2->validateEndFunction = local_2468.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2468._72_8_;
    pmVar2->validateBeginFunction = local_2468.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2468._56_8_;
    pmVar2->endFunction = local_2468.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2468._40_8_;
    pmVar2->textDataFunction = local_2468.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2468._24_8_;
    pmVar2->beginFunction = local_2468.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2468._8_8_;
    local_2538 = ColladaParserAutoGen14Private::_begin__plane;
    local_2530 = 0;
    local_2548 = ColladaParserAutoGen14Private::_data__plane;
    local_2540 = 0;
    local_2558 = ColladaParserAutoGen14Private::_end__plane;
    uStack_2550 = 0;
    local_2568 = ColladaParserAutoGen14Private::_preBegin__plane;
    uStack_2560 = 0;
    local_2578 = ColladaParserAutoGen14Private::_preEnd__plane;
    uStack_2570 = 0;
    local_2588 = ColladaParserAutoGen14Private::_freeAttributes__plane;
    uStack_2580 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_2528,0x84f2c0,0,0x8742f0,0,(ElementValidateEndFunctionPtr)pcVar3,0x84f2f0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_2528.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2528._88_8_;
    pmVar2->validateEndFunction = local_2528.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2528._72_8_;
    pmVar2->validateBeginFunction = local_2528.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2528._56_8_;
    pmVar2->endFunction = local_2528.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2528._40_8_;
    pmVar2->textDataFunction = local_2528.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2528._24_8_;
    pmVar2->beginFunction = local_2528.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2528._8_8_;
    local_25f8 = ColladaParserAutoGen14Private::_begin__sphere;
    local_25f0 = 0;
    local_2608 = ColladaParserAutoGen14Private::_data__sphere;
    local_2600 = 0;
    local_2618 = ColladaParserAutoGen14Private::_end__sphere;
    uStack_2610 = 0;
    local_2628 = ColladaParserAutoGen14Private::_preBegin__sphere;
    uStack_2620 = 0;
    local_2638 = ColladaParserAutoGen14Private::_preEnd__sphere;
    uStack_2630 = 0;
    local_2648 = ColladaParserAutoGen14Private::_freeAttributes__sphere;
    uStack_2640 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_25e8,0x84fa90,0,0x874530,0,(ElementValidateEndFunctionPtr)pcVar3,0x84fac0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_25e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_25e8._88_8_;
    pmVar2->validateEndFunction = local_25e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_25e8._72_8_;
    pmVar2->validateBeginFunction = local_25e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_25e8._56_8_;
    pmVar2->endFunction = local_25e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_25e8._40_8_;
    pmVar2->textDataFunction = local_25e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_25e8._24_8_;
    pmVar2->beginFunction = local_25e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_25e8._8_8_;
    local_26b8 = ColladaParserAutoGen14Private::_begin__tapered_capsule;
    local_26b0 = 0;
    local_26c8 = ColladaParserAutoGen14Private::_data__tapered_capsule;
    local_26c0 = 0;
    local_26d8 = ColladaParserAutoGen14Private::_end__tapered_capsule;
    uStack_26d0 = 0;
    local_26e8 = ColladaParserAutoGen14Private::_preBegin__tapered_capsule;
    uStack_26e0 = 0;
    local_26f8 = ColladaParserAutoGen14Private::_preEnd__tapered_capsule;
    uStack_26f0 = 0;
    local_2708 = ColladaParserAutoGen14Private::_freeAttributes__tapered_capsule;
    uStack_2700 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_26a8,0x84fb80,0,0x874d30,0,(ElementValidateEndFunctionPtr)pcVar3,0x84fbb0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_26a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_26a8._88_8_;
    pmVar2->validateEndFunction = local_26a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_26a8._72_8_;
    pmVar2->validateBeginFunction = local_26a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_26a8._56_8_;
    pmVar2->endFunction = local_26a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_26a8._40_8_;
    pmVar2->textDataFunction = local_26a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_26a8._24_8_;
    pmVar2->beginFunction = local_26a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_26a8._8_8_;
    local_2778 = ColladaParserAutoGen14Private::_begin__tapered_cylinder;
    local_2770 = 0;
    local_2788 = ColladaParserAutoGen14Private::_data__tapered_cylinder;
    local_2780 = 0;
    local_2798 = ColladaParserAutoGen14Private::_end__tapered_cylinder;
    uStack_2790 = 0;
    local_27a8 = ColladaParserAutoGen14Private::_preBegin__tapered_cylinder;
    uStack_27a0 = 0;
    local_27b8 = ColladaParserAutoGen14Private::_preEnd__tapered_cylinder;
    uStack_27b0 = 0;
    local_27c8 = ColladaParserAutoGen14Private::_freeAttributes__tapered_cylinder;
    uStack_27c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_2768,0x84fbd0,0,0x874af0,0,(ElementValidateEndFunctionPtr)pcVar3,0x84fc00);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_2768.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2768._88_8_;
    pmVar2->validateEndFunction = local_2768.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2768._72_8_;
    pmVar2->validateBeginFunction = local_2768.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2768._56_8_;
    pmVar2->endFunction = local_2768.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2768._40_8_;
    pmVar2->textDataFunction = local_2768.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2768._24_8_;
    pmVar2->beginFunction = local_2768.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2768._8_8_;
    local_2838 = ColladaParserAutoGen14Private::_begin__half_extents;
    local_2830 = 0;
    local_2848 = ColladaParserAutoGen14Private::_data__half_extents;
    local_2840 = 0;
    local_2858 = ColladaParserAutoGen14Private::_end__half_extents;
    uStack_2850 = 0;
    local_2868 = ColladaParserAutoGen14Private::_preBegin__half_extents;
    uStack_2860 = 0;
    local_2878 = ColladaParserAutoGen14Private::_preEnd__half_extents;
    uStack_2870 = 0;
    local_2888 = ColladaParserAutoGen14Private::_freeAttributes__half_extents;
    uStack_2880 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_2828,0x85b3e0,0,0x874470,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b410);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_2828.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2828._88_8_;
    pmVar2->validateEndFunction = local_2828.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2828._72_8_;
    pmVar2->validateBeginFunction = local_2828.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2828._56_8_;
    pmVar2->endFunction = local_2828.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2828._40_8_;
    pmVar2->textDataFunction = local_2828.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2828._24_8_;
    pmVar2->beginFunction = local_2828.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2828._8_8_;
    local_28f8 = ColladaParserAutoGen14Private::_begin__height;
    local_28f0 = 0;
    local_2908 = ColladaParserAutoGen14Private::_data__height;
    local_2900 = 0;
    local_2918 = ColladaParserAutoGen14Private::_end__height;
    uStack_2910 = 0;
    local_2928 = ColladaParserAutoGen14Private::_preBegin__height;
    uStack_2920 = 0;
    local_2938 = ColladaParserAutoGen14Private::_preEnd__height;
    uStack_2930 = 0;
    local_2948 = ColladaParserAutoGen14Private::_freeAttributes__height;
    uStack_2940 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_28e8,0x85b430,0,0x874810,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b460);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8);
    pmVar2->freeAttributesFunction = local_28e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_28e8._88_8_;
    pmVar2->validateEndFunction = local_28e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_28e8._72_8_;
    pmVar2->validateBeginFunction = local_28e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_28e8._56_8_;
    pmVar2->endFunction = local_28e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_28e8._40_8_;
    pmVar2->textDataFunction = local_28e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_28e8._24_8_;
    pmVar2->beginFunction = local_28e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_28e8._8_8_;
    __k = ColladaParserAutoGen14Private::_begin__radius____float2;
    local_29b8 = ColladaParserAutoGen14Private::_begin__radius____float2;
    local_29b0 = 0;
    this = ColladaParserAutoGen14Private::_data__radius____float2;
    local_29c8 = ColladaParserAutoGen14Private::_data__radius____float2;
    local_29c0 = 0;
    local_29d8 = ColladaParserAutoGen14Private::_end__radius____float2;
    uStack_29d0 = 0;
    local_29e8 = ColladaParserAutoGen14Private::_preBegin__radius____float2;
    uStack_29e0 = 0;
    local_29f8 = ColladaParserAutoGen14Private::_preEnd__radius____float2;
    uStack_29f0 = 0;
    local_2a08 = ColladaParserAutoGen14Private::_freeAttributes__radius____float2;
    uStack_2a00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_29a8,0x85b480,0,0x874a30,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b4b0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_29a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_29a8._88_8_;
    pmVar2->validateEndFunction = local_29a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_29a8._72_8_;
    pmVar2->validateBeginFunction = local_29a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_29a8._56_8_;
    pmVar2->endFunction = local_29a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_29a8._40_8_;
    pmVar2->textDataFunction = local_29a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_29a8._24_8_;
    pmVar2->beginFunction = local_29a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_29a8._8_8_;
    local_2a78 = ColladaParserAutoGen14Private::_begin__height;
    local_2a70 = 0;
    local_2a88 = ColladaParserAutoGen14Private::_data__height;
    local_2a80 = 0;
    local_2a98 = ColladaParserAutoGen14Private::_end__height;
    uStack_2a90 = 0;
    local_2aa8 = ColladaParserAutoGen14Private::_preBegin__height;
    uStack_2aa0 = 0;
    local_2ab8 = ColladaParserAutoGen14Private::_preEnd__height;
    uStack_2ab0 = 0;
    local_2ac8 = ColladaParserAutoGen14Private::_freeAttributes__height;
    uStack_2ac0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_2a68,0x85b430,0,0x874810,0,0x874920,0x85b460);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen14Private::_preBegin__radius____float2;
    pmVar2->freeAttributesFunction = local_2a68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2a68._88_8_;
    pmVar2->validateEndFunction = local_2a68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2a68._72_8_;
    pmVar2->validateBeginFunction = local_2a68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2a68._56_8_;
    pmVar2->endFunction = local_2a68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2a68._40_8_;
    pmVar2->textDataFunction = local_2a68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2a68._24_8_;
    pmVar2->beginFunction = local_2a68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2a68._8_8_;
    local_2b30 = 0;
    local_2b40 = 0;
    local_2b58 = ColladaParserAutoGen14Private::_end__radius____float2;
    uStack_2b50 = 0;
    local_2b68 = ColladaParserAutoGen14Private::_preBegin__radius____float2;
    uStack_2b60 = 0;
    local_2b78 = ColladaParserAutoGen14Private::_preEnd__radius____float2;
    uStack_2b70 = 0;
    local_2b88 = ColladaParserAutoGen14Private::_freeAttributes__radius____float2;
    uStack_2b80 = 0;
    local_2b48 = (map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                  *)this;
    local_2b38 = __k;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_2b28,(ElementBeginFunctionPtr)__k,0,(ElementEndFunctionPtr)this,0,0x874a80,
               0x85b4b0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2b28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2b28._88_8_;
    pmVar2->validateEndFunction = local_2b28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2b28._72_8_;
    pmVar2->validateBeginFunction = local_2b28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2b28._56_8_;
    pmVar2->endFunction = local_2b28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2b28._40_8_;
    pmVar2->textDataFunction = local_2b28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2b28._24_8_;
    pmVar2->beginFunction = local_2b28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2b28._8_8_;
    local_2bf8 = ColladaParserAutoGen14Private::_begin__bind_material;
    local_2bf0 = 0;
    local_2c08 = ColladaParserAutoGen14Private::_data__bind_material;
    local_2c00 = 0;
    local_2c18 = ColladaParserAutoGen14Private::_end__bind_material;
    uStack_2c10 = 0;
    local_2c28 = ColladaParserAutoGen14Private::_preBegin__bind_material;
    uStack_2c20 = 0;
    local_2c38 = ColladaParserAutoGen14Private::_preEnd__bind_material;
    uStack_2c30 = 0;
    local_2c48 = ColladaParserAutoGen14Private::_freeAttributes__bind_material;
    uStack_2c40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_2be8,0x84e2d0,0,0x870980,0,(ElementValidateEndFunctionPtr)pcVar3,0x84e300);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2be8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2be8._88_8_;
    pmVar2->validateEndFunction = local_2be8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2be8._72_8_;
    pmVar2->validateBeginFunction = local_2be8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2be8._56_8_;
    pmVar2->endFunction = local_2be8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2be8._40_8_;
    pmVar2->textDataFunction = local_2be8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2be8._24_8_;
    pmVar2->beginFunction = local_2be8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2be8._8_8_;
    local_2cb8 = ColladaParserAutoGen14Private::_begin__param;
    local_2cb0 = 0;
    local_2cc8 = ColladaParserAutoGen14Private::_data__param;
    local_2cc0 = 0;
    local_2cd8 = ColladaParserAutoGen14Private::_end__param;
    uStack_2cd0 = 0;
    local_2ce8 = ColladaParserAutoGen14Private::_preBegin__param;
    uStack_2ce0 = 0;
    local_2cf8 = ColladaParserAutoGen14Private::_preEnd__param;
    uStack_2cf0 = 0;
    local_2d08 = ColladaParserAutoGen14Private::_freeAttributes__param;
    uStack_2d00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_2ca8,0x850b20,0,0x85f1e0,0,(ElementValidateEndFunctionPtr)pcVar3,0x850b50);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2ca8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2ca8._88_8_;
    pmVar2->validateEndFunction = local_2ca8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2ca8._72_8_;
    pmVar2->validateBeginFunction = local_2ca8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2ca8._56_8_;
    pmVar2->endFunction = local_2ca8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2ca8._40_8_;
    pmVar2->textDataFunction = local_2ca8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2ca8._24_8_;
    pmVar2->beginFunction = local_2ca8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2ca8._8_8_;
    local_2d78 = ColladaParserAutoGen14Private::_begin__bind_material__technique_common;
    local_2d70 = 0;
    local_2d88 = ColladaParserAutoGen14Private::_data__bind_material__technique_common;
    local_2d80 = 0;
    local_2d98 = ColladaParserAutoGen14Private::_end__bind_material__technique_common;
    uStack_2d90 = 0;
    local_2da8 = ColladaParserAutoGen14Private::_preBegin__bind_material__technique_common;
    uStack_2da0 = 0;
    local_2db8 = ColladaParserAutoGen14Private::_preEnd__bind_material__technique_common;
    uStack_2db0 = 0;
    local_2dc8 = ColladaParserAutoGen14Private::_freeAttributes__bind_material__technique_common;
    uStack_2dc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_2d68,0x85af30,0,0x8709e0,0,(ElementValidateEndFunctionPtr)pcVar3,0x85af60);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2d68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2d68._88_8_;
    pmVar2->validateEndFunction = local_2d68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2d68._72_8_;
    pmVar2->validateBeginFunction = local_2d68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2d68._56_8_;
    pmVar2->endFunction = local_2d68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2d68._40_8_;
    pmVar2->textDataFunction = local_2d68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2d68._24_8_;
    pmVar2->beginFunction = local_2d68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2d68._8_8_;
    local_2e38 = ColladaParserAutoGen14Private::_begin__instance_material;
    local_2e30 = 0;
    local_2e48 = ColladaParserAutoGen14Private::_data__instance_material;
    local_2e40 = 0;
    local_2e58 = ColladaParserAutoGen14Private::_end__instance_material;
    uStack_2e50 = 0;
    local_2e68 = ColladaParserAutoGen14Private::_preBegin__instance_material;
    uStack_2e60 = 0;
    local_2e78 = ColladaParserAutoGen14Private::_preEnd__instance_material;
    uStack_2e70 = 0;
    local_2e88 = ColladaParserAutoGen14Private::_freeAttributes__instance_material;
    uStack_2e80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_2e28,0x84eb40,0,0x870a40,0,(ElementValidateEndFunctionPtr)pcVar3,0x84eb70);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2e28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2e28._88_8_;
    pmVar2->validateEndFunction = local_2e28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2e28._72_8_;
    pmVar2->validateBeginFunction = local_2e28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2e28._56_8_;
    pmVar2->endFunction = local_2e28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2e28._40_8_;
    pmVar2->textDataFunction = local_2e28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2e28._24_8_;
    pmVar2->beginFunction = local_2e28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2e28._8_8_;
    local_2ef8 = ColladaParserAutoGen14Private::_begin__instance_material__bind;
    local_2ef0 = 0;
    local_2f08 = ColladaParserAutoGen14Private::_data__instance_material__bind;
    local_2f00 = 0;
    local_2f18 = ColladaParserAutoGen14Private::_end__instance_material__bind;
    uStack_2f10 = 0;
    local_2f28 = ColladaParserAutoGen14Private::_preBegin__instance_material__bind;
    uStack_2f20 = 0;
    local_2f38 = ColladaParserAutoGen14Private::_preEnd__instance_material__bind;
    uStack_2f30 = 0;
    local_2f48 = ColladaParserAutoGen14Private::_freeAttributes__instance_material__bind;
    uStack_2f40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_2ee8,0x85af80,0,0x870e60,0,(ElementValidateEndFunctionPtr)pcVar3,0x85afb0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2ee8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2ee8._88_8_;
    pmVar2->validateEndFunction = local_2ee8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2ee8._72_8_;
    pmVar2->validateBeginFunction = local_2ee8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2ee8._56_8_;
    pmVar2->endFunction = local_2ee8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2ee8._40_8_;
    pmVar2->textDataFunction = local_2ee8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2ee8._24_8_;
    pmVar2->beginFunction = local_2ee8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2ee8._8_8_;
    local_2fb8 = ColladaParserAutoGen14Private::_begin__bind_vertex_input;
    local_2fb0 = 0;
    local_2fc8 = ColladaParserAutoGen14Private::_data__bind_vertex_input;
    local_2fc0 = 0;
    local_2fd8 = ColladaParserAutoGen14Private::_end__bind_vertex_input;
    uStack_2fd0 = 0;
    local_2fe8 = ColladaParserAutoGen14Private::_preBegin__bind_vertex_input;
    uStack_2fe0 = 0;
    local_2ff8 = ColladaParserAutoGen14Private::_preEnd__bind_vertex_input;
    uStack_2ff0 = 0;
    local_3008 = ColladaParserAutoGen14Private::_freeAttributes__bind_vertex_input;
    uStack_3000 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_2fa8,0x85afd0,0,0x871070,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b000);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_2fa8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2fa8._88_8_;
    pmVar2->validateEndFunction = local_2fa8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2fa8._72_8_;
    pmVar2->validateBeginFunction = local_2fa8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2fa8._56_8_;
    pmVar2->endFunction = local_2fa8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2fa8._40_8_;
    pmVar2->textDataFunction = local_2fa8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2fa8._24_8_;
    pmVar2->beginFunction = local_2fa8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2fa8._8_8_;
    local_3078 = ColladaParserAutoGen14Private::_begin__equation;
    local_3070 = 0;
    local_3088 = ColladaParserAutoGen14Private::_data__equation;
    local_3080 = 0;
    local_3098 = ColladaParserAutoGen14Private::_end__equation;
    uStack_3090 = 0;
    local_30a8 = ColladaParserAutoGen14Private::_preBegin__equation;
    uStack_30a0 = 0;
    local_30b8 = ColladaParserAutoGen14Private::_preEnd__equation;
    uStack_30b0 = 0;
    local_30c8 = ColladaParserAutoGen14Private::_freeAttributes__equation;
    uStack_30c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3068,0x85b4d0,0,0x874350,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b500);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3068.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3068._88_8_;
    pmVar2->validateEndFunction = local_3068.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3068._72_8_;
    pmVar2->validateBeginFunction = local_3068.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3068._56_8_;
    pmVar2->endFunction = local_3068.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3068._40_8_;
    pmVar2->textDataFunction = local_3068.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3068._24_8_;
    pmVar2->beginFunction = local_3068.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3068._8_8_;
    local_3138 = ColladaParserAutoGen14Private::_begin__radius____float;
    local_3130 = 0;
    local_3148 = ColladaParserAutoGen14Private::_data__radius____float;
    local_3140 = 0;
    local_3158 = ColladaParserAutoGen14Private::_end__radius____float;
    uStack_3150 = 0;
    local_3168 = ColladaParserAutoGen14Private::_preBegin__radius____float;
    uStack_3160 = 0;
    local_3178 = ColladaParserAutoGen14Private::_preEnd__radius____float;
    uStack_3170 = 0;
    local_3188 = ColladaParserAutoGen14Private::_freeAttributes__radius____float;
    uStack_3180 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3128,0x85b520,0,0x874590,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b550);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen14Private::_preBegin__height;
    pmVar2->freeAttributesFunction = local_3128.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3128._88_8_;
    pmVar2->validateEndFunction = local_3128.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3128._72_8_;
    pmVar2->validateBeginFunction = local_3128.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3128._56_8_;
    pmVar2->endFunction = local_3128.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3128._40_8_;
    pmVar2->textDataFunction = local_3128.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3128._24_8_;
    pmVar2->beginFunction = local_3128.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3128._8_8_;
    local_31f8 = ColladaParserAutoGen14Private::_begin__height;
    local_31f0 = 0;
    local_3208 = ColladaParserAutoGen14Private::_data__height;
    local_3200 = 0;
    local_3218 = ColladaParserAutoGen14Private::_end__height;
    uStack_3210 = 0;
    local_3228 = ColladaParserAutoGen14Private::_preBegin__height;
    uStack_3220 = 0;
    local_3238 = ColladaParserAutoGen14Private::_preEnd__height;
    uStack_3230 = 0;
    local_3248 = ColladaParserAutoGen14Private::_freeAttributes__height;
    uStack_3240 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_31e8,0x85b430,0,0x874810,0,0x874920,0x85b460);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_31e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_31e8._88_8_;
    pmVar2->validateEndFunction = local_31e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_31e8._72_8_;
    pmVar2->validateBeginFunction = local_31e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_31e8._56_8_;
    pmVar2->endFunction = local_31e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_31e8._40_8_;
    pmVar2->textDataFunction = local_31e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_31e8._24_8_;
    pmVar2->beginFunction = local_31e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_31e8._8_8_;
    local_32b8 = ColladaParserAutoGen14Private::_begin__radius1;
    local_32b0 = 0;
    local_32c8 = ColladaParserAutoGen14Private::_data__radius1;
    local_32c0 = 0;
    local_32d8 = ColladaParserAutoGen14Private::_end__radius1;
    uStack_32d0 = 0;
    local_32e8 = ColladaParserAutoGen14Private::_preBegin__radius1;
    uStack_32e0 = 0;
    local_32f8 = ColladaParserAutoGen14Private::_preEnd__radius1;
    uStack_32f0 = 0;
    local_3308 = ColladaParserAutoGen14Private::_freeAttributes__radius1;
    uStack_3300 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_32a8,0x85b570,0,0x874b50,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b5a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_32a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_32a8._88_8_;
    pmVar2->validateEndFunction = local_32a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_32a8._72_8_;
    pmVar2->validateBeginFunction = local_32a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_32a8._56_8_;
    pmVar2->endFunction = local_32a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_32a8._40_8_;
    pmVar2->textDataFunction = local_32a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_32a8._24_8_;
    pmVar2->beginFunction = local_32a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_32a8._8_8_;
    local_3378 = ColladaParserAutoGen14Private::_begin__radius2;
    local_3370 = 0;
    local_3388 = ColladaParserAutoGen14Private::_data__radius2;
    local_3380 = 0;
    local_3398 = ColladaParserAutoGen14Private::_end__radius2;
    uStack_3390 = 0;
    local_33a8 = ColladaParserAutoGen14Private::_preBegin__radius2;
    uStack_33a0 = 0;
    local_33b8 = ColladaParserAutoGen14Private::_preEnd__radius2;
    uStack_33b0 = 0;
    local_33c8 = ColladaParserAutoGen14Private::_freeAttributes__radius2;
    uStack_33c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3368,0x85b5c0,0,0x874c10,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b5f0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3368.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3368._88_8_;
    pmVar2->validateEndFunction = local_3368.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3368._72_8_;
    pmVar2->validateBeginFunction = local_3368.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3368._56_8_;
    pmVar2->endFunction = local_3368.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3368._40_8_;
    pmVar2->textDataFunction = local_3368.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3368._24_8_;
    pmVar2->beginFunction = local_3368.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3368._8_8_;
    local_3438 = ColladaParserAutoGen14Private::_begin__height;
    local_3430 = 0;
    local_3448 = ColladaParserAutoGen14Private::_data__height;
    local_3440 = 0;
    local_3458 = ColladaParserAutoGen14Private::_end__height;
    uStack_3450 = 0;
    local_3468 = ColladaParserAutoGen14Private::_preBegin__height;
    uStack_3460 = 0;
    local_3478 = ColladaParserAutoGen14Private::_preEnd__height;
    uStack_3470 = 0;
    local_3488 = ColladaParserAutoGen14Private::_freeAttributes__height;
    uStack_3480 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_3428,0x85b430,0,0x874810,0,0x874920,0x85b460);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3428.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3428._88_8_;
    pmVar2->validateEndFunction = local_3428.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3428._72_8_;
    pmVar2->validateBeginFunction = local_3428.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3428._56_8_;
    pmVar2->endFunction = local_3428.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3428._40_8_;
    pmVar2->textDataFunction = local_3428.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3428._24_8_;
    pmVar2->beginFunction = local_3428.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3428._8_8_;
    local_34f8 = ColladaParserAutoGen14Private::_begin__radius1;
    local_34f0 = 0;
    local_3508 = ColladaParserAutoGen14Private::_data__radius1;
    local_3500 = 0;
    local_3518 = ColladaParserAutoGen14Private::_end__radius1;
    uStack_3510 = 0;
    local_3528 = ColladaParserAutoGen14Private::_preBegin__radius1;
    uStack_3520 = 0;
    local_3538 = ColladaParserAutoGen14Private::_preEnd__radius1;
    uStack_3530 = 0;
    local_3548 = ColladaParserAutoGen14Private::_freeAttributes__radius1;
    uStack_3540 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_34e8,0x85b570,0,0x874b50,0,0x874ba0,0x85b5a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen14Private::_preBegin__radius2;
    pmVar2->freeAttributesFunction = local_34e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_34e8._88_8_;
    pmVar2->validateEndFunction = local_34e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_34e8._72_8_;
    pmVar2->validateBeginFunction = local_34e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_34e8._56_8_;
    pmVar2->endFunction = local_34e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_34e8._40_8_;
    pmVar2->textDataFunction = local_34e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_34e8._24_8_;
    pmVar2->beginFunction = local_34e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_34e8._8_8_;
    local_35b8 = ColladaParserAutoGen14Private::_begin__radius2;
    local_35b0 = 0;
    local_35c8 = ColladaParserAutoGen14Private::_data__radius2;
    local_35c0 = 0;
    local_35d8 = ColladaParserAutoGen14Private::_end__radius2;
    uStack_35d0 = 0;
    local_35e8 = ColladaParserAutoGen14Private::_preBegin__radius2;
    uStack_35e0 = 0;
    local_35f8 = ColladaParserAutoGen14Private::_preEnd__radius2;
    uStack_35f0 = 0;
    local_3608 = ColladaParserAutoGen14Private::_freeAttributes__radius2;
    uStack_3600 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_35a8,0x85b5c0,0,0x874c10,0,0x874c60,0x85b5f0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_35a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_35a8._88_8_;
    pmVar2->validateEndFunction = local_35a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_35a8._72_8_;
    pmVar2->validateBeginFunction = local_35a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_35a8._56_8_;
    pmVar2->endFunction = local_35a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_35a8._40_8_;
    pmVar2->textDataFunction = local_35a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_35a8._24_8_;
    pmVar2->beginFunction = local_35a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_35a8._8_8_;
    local_3678 = ColladaParserAutoGen14Private::_begin__rigid_body__technique_common;
    local_3670 = 0;
    local_3688 = ColladaParserAutoGen14Private::_data__rigid_body__technique_common;
    local_3680 = 0;
    local_3698 = ColladaParserAutoGen14Private::_end__rigid_body__technique_common;
    uStack_3690 = 0;
    local_36a8 = ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common;
    uStack_36a0 = 0;
    local_36b8 = ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common;
    uStack_36b0 = 0;
    local_36c8 = ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common;
    uStack_36c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3668,0x85b610,0,0x872fe0,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b640);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3668.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3668._88_8_;
    pmVar2->validateEndFunction = local_3668.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3668._72_8_;
    pmVar2->validateBeginFunction = local_3668.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3668._56_8_;
    pmVar2->endFunction = local_3668.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3668._40_8_;
    pmVar2->textDataFunction = local_3668.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3668._24_8_;
    pmVar2->beginFunction = local_3668.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3668._8_8_;
    local_3738 = ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__dynamic;
    local_3730 = 0;
    local_3748 = ColladaParserAutoGen14Private::_data__rigid_body__technique_common__dynamic;
    local_3740 = 0;
    local_3758 = ColladaParserAutoGen14Private::_end__rigid_body__technique_common__dynamic;
    uStack_3750 = 0;
    local_3768 = ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__dynamic;
    uStack_3760 = 0;
    local_3778 = ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__dynamic;
    uStack_3770 = 0;
    local_3788 = ColladaParserAutoGen14Private::
                 _freeAttributes__rigid_body__technique_common__dynamic;
    uStack_3780 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3728,0x85b660,0,0x873040,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b690);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3728.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3728._88_8_;
    pmVar2->validateEndFunction = local_3728.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3728._72_8_;
    pmVar2->validateBeginFunction = local_3728.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3728._56_8_;
    pmVar2->endFunction = local_3728.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3728._40_8_;
    pmVar2->textDataFunction = local_3728.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3728._24_8_;
    pmVar2->beginFunction = local_3728.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3728._8_8_;
    local_37f8 = ColladaParserAutoGen14Private::_begin__inertia;
    local_37f0 = 0;
    local_3808 = ColladaParserAutoGen14Private::_data__inertia;
    local_3800 = 0;
    local_3818 = ColladaParserAutoGen14Private::_end__inertia;
    uStack_3810 = 0;
    local_3828 = ColladaParserAutoGen14Private::_preBegin__inertia;
    uStack_3820 = 0;
    local_3838 = ColladaParserAutoGen14Private::_preEnd__inertia;
    uStack_3830 = 0;
    local_3848 = ColladaParserAutoGen14Private::_freeAttributes__inertia;
    uStack_3840 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_37e8,0x85b200,0,0x8736e0,0,0x873730,0x85b230);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen14Private::_preBegin__mass;
    pmVar2->freeAttributesFunction = local_37e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_37e8._88_8_;
    pmVar2->validateEndFunction = local_37e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_37e8._72_8_;
    pmVar2->validateBeginFunction = local_37e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_37e8._56_8_;
    pmVar2->endFunction = local_37e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_37e8._40_8_;
    pmVar2->textDataFunction = local_37e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_37e8._24_8_;
    pmVar2->beginFunction = local_37e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_37e8._8_8_;
    local_38b8 = ColladaParserAutoGen14Private::_begin__mass;
    local_38b0 = 0;
    local_38c8 = ColladaParserAutoGen14Private::_data__mass;
    local_38c0 = 0;
    local_38d8 = ColladaParserAutoGen14Private::_end__mass;
    uStack_38d0 = 0;
    local_38e8 = ColladaParserAutoGen14Private::_preBegin__mass;
    uStack_38e0 = 0;
    local_38f8 = ColladaParserAutoGen14Private::_preEnd__mass;
    uStack_38f0 = 0;
    local_3908 = ColladaParserAutoGen14Private::_freeAttributes__mass;
    uStack_3900 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_38a8,0x85b250,0,0x873360,0,0x873470,0x85b280);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_38a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_38a8._88_8_;
    pmVar2->validateEndFunction = local_38a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_38a8._72_8_;
    pmVar2->validateBeginFunction = local_38a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_38a8._56_8_;
    pmVar2->endFunction = local_38a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_38a8._40_8_;
    pmVar2->textDataFunction = local_38a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_38a8._24_8_;
    pmVar2->beginFunction = local_38a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_38a8._8_8_;
    local_3978 = ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__mass_frame;
    local_3970 = 0;
    local_3988 = ColladaParserAutoGen14Private::_data__rigid_body__technique_common__mass_frame;
    local_3980 = 0;
    local_3998 = ColladaParserAutoGen14Private::_end__rigid_body__technique_common__mass_frame;
    uStack_3990 = 0;
    local_39a8 = ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__mass_frame;
    uStack_39a0 = 0;
    local_39b8 = ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__mass_frame;
    uStack_39b0 = 0;
    local_39c8 = ColladaParserAutoGen14Private::
                 _freeAttributes__rigid_body__technique_common__mass_frame;
    uStack_39c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3968,0x85b6b0,0,0x873680,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b6e0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3968.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3968._88_8_;
    pmVar2->validateEndFunction = local_3968.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3968._72_8_;
    pmVar2->validateBeginFunction = local_3968.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3968._56_8_;
    pmVar2->endFunction = local_3968.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3968._40_8_;
    pmVar2->textDataFunction = local_3968.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3968._24_8_;
    pmVar2->beginFunction = local_3968.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3968._8_8_;
    local_3a38 = ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__shape;
    local_3a30 = 0;
    local_3a48 = ColladaParserAutoGen14Private::_data__rigid_body__technique_common__shape;
    local_3a40 = 0;
    local_3a58 = ColladaParserAutoGen14Private::_end__rigid_body__technique_common__shape;
    uStack_3a50 = 0;
    local_3a68 = ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__shape;
    uStack_3a60 = 0;
    local_3a78 = ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__shape;
    uStack_3a70 = 0;
    local_3a88 = ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__shape
    ;
    uStack_3a80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3a28,0x85b700,0,0x873c50,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b730);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen14Private::_preBegin__density;
    pmVar2->freeAttributesFunction = local_3a28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3a28._88_8_;
    pmVar2->validateEndFunction = local_3a28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3a28._72_8_;
    pmVar2->validateBeginFunction = local_3a28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3a28._56_8_;
    pmVar2->endFunction = local_3a28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3a28._40_8_;
    pmVar2->textDataFunction = local_3a28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3a28._24_8_;
    pmVar2->beginFunction = local_3a28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3a28._8_8_;
    local_3af8 = ColladaParserAutoGen14Private::_begin__density;
    local_3af0 = 0;
    local_3b08 = ColladaParserAutoGen14Private::_data__density;
    local_3b00 = 0;
    local_3b18 = ColladaParserAutoGen14Private::_end__density;
    uStack_3b10 = 0;
    local_3b28 = ColladaParserAutoGen14Private::_preBegin__density;
    uStack_3b20 = 0;
    local_3b38 = ColladaParserAutoGen14Private::_preEnd__density;
    uStack_3b30 = 0;
    local_3b48 = ColladaParserAutoGen14Private::_freeAttributes__density;
    uStack_3b40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_3ae8,0x85b340,0,0x873fd0,0,0x8740e0,0x85b370);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3ae8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3ae8._88_8_;
    pmVar2->validateEndFunction = local_3ae8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3ae8._72_8_;
    pmVar2->validateBeginFunction = local_3ae8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3ae8._56_8_;
    pmVar2->endFunction = local_3ae8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3ae8._40_8_;
    pmVar2->textDataFunction = local_3ae8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3ae8._24_8_;
    pmVar2->beginFunction = local_3ae8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3ae8._8_8_;
    local_3bb8 = ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__shape__hollow;
    local_3bb0 = 0;
    local_3bc8 = ColladaParserAutoGen14Private::_data__rigid_body__technique_common__shape__hollow;
    local_3bc0 = 0;
    local_3bd8 = ColladaParserAutoGen14Private::_end__rigid_body__technique_common__shape__hollow;
    uStack_3bd0 = 0;
    local_3be8 = ColladaParserAutoGen14Private::
                 _preBegin__rigid_body__technique_common__shape__hollow;
    uStack_3be0 = 0;
    local_3bf8 = ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__shape__hollow
    ;
    uStack_3bf0 = 0;
    local_3c08 = ColladaParserAutoGen14Private::
                 _freeAttributes__rigid_body__technique_common__shape__hollow;
    uStack_3c00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3ba8,0x85b750,0,0x873cb0,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b780);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen14Private::_preBegin__mass;
    pmVar2->freeAttributesFunction = local_3ba8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3ba8._88_8_;
    pmVar2->validateEndFunction = local_3ba8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3ba8._72_8_;
    pmVar2->validateBeginFunction = local_3ba8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3ba8._56_8_;
    pmVar2->endFunction = local_3ba8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3ba8._40_8_;
    pmVar2->textDataFunction = local_3ba8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3ba8._24_8_;
    pmVar2->beginFunction = local_3ba8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3ba8._8_8_;
    local_3c78 = ColladaParserAutoGen14Private::_begin__mass;
    local_3c70 = 0;
    local_3c88 = ColladaParserAutoGen14Private::_data__mass;
    local_3c80 = 0;
    local_3c98 = ColladaParserAutoGen14Private::_end__mass;
    uStack_3c90 = 0;
    local_3ca8 = ColladaParserAutoGen14Private::_preBegin__mass;
    uStack_3ca0 = 0;
    local_3cb8 = ColladaParserAutoGen14Private::_preEnd__mass;
    uStack_3cb0 = 0;
    local_3cc8 = ColladaParserAutoGen14Private::_freeAttributes__mass;
    uStack_3cc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_3c68,0x85b250,0,0x873360,0,0x873470,0x85b280);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3c68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3c68._88_8_;
    pmVar2->validateEndFunction = local_3c68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3c68._72_8_;
    pmVar2->validateBeginFunction = local_3c68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3c68._56_8_;
    pmVar2->endFunction = local_3c68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3c68._40_8_;
    pmVar2->textDataFunction = local_3c68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3c68._24_8_;
    pmVar2->beginFunction = local_3c68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3c68._8_8_;
    local_3d38 = ColladaParserAutoGen14Private::_begin__attachment;
    local_3d30 = 0;
    local_3d48 = ColladaParserAutoGen14Private::_data__attachment;
    local_3d40 = 0;
    local_3d58 = ColladaParserAutoGen14Private::_end__attachment;
    uStack_3d50 = 0;
    local_3d68 = ColladaParserAutoGen14Private::_preBegin__attachment;
    uStack_3d60 = 0;
    local_3d78 = ColladaParserAutoGen14Private::_preEnd__attachment;
    uStack_3d70 = 0;
    local_3d88 = ColladaParserAutoGen14Private::_freeAttributes__attachment;
    uStack_3d80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3d28,0x84e230,0,0x875270,0,(ElementValidateEndFunctionPtr)pcVar3,0x84e260);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3d28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3d28._88_8_;
    pmVar2->validateEndFunction = local_3d28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3d28._72_8_;
    pmVar2->validateBeginFunction = local_3d28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3d28._56_8_;
    pmVar2->endFunction = local_3d28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3d28._40_8_;
    pmVar2->textDataFunction = local_3d28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3d28._24_8_;
    pmVar2->beginFunction = local_3d28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3d28._8_8_;
    local_3df8 = ColladaParserAutoGen14Private::_begin__ref_attachment;
    local_3df0 = 0;
    local_3e08 = ColladaParserAutoGen14Private::_data__ref_attachment;
    local_3e00 = 0;
    local_3e18 = ColladaParserAutoGen14Private::_end__ref_attachment;
    uStack_3e10 = 0;
    local_3e28 = ColladaParserAutoGen14Private::_preBegin__ref_attachment;
    uStack_3e20 = 0;
    local_3e38 = ColladaParserAutoGen14Private::_preEnd__ref_attachment;
    uStack_3e30 = 0;
    local_3e48 = ColladaParserAutoGen14Private::_freeAttributes__ref_attachment;
    uStack_3e40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3de8,0x84f4f0,0,0x874f60,0,(ElementValidateEndFunctionPtr)pcVar3,0x84f520);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3de8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3de8._88_8_;
    pmVar2->validateEndFunction = local_3de8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3de8._72_8_;
    pmVar2->validateBeginFunction = local_3de8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3de8._56_8_;
    pmVar2->endFunction = local_3de8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3de8._40_8_;
    pmVar2->textDataFunction = local_3de8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3de8._24_8_;
    pmVar2->beginFunction = local_3de8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3de8._8_8_;
    local_3eb8 = ColladaParserAutoGen14Private::_begin__rigid_constraint__technique_common;
    local_3eb0 = 0;
    local_3ec8 = ColladaParserAutoGen14Private::_data__rigid_constraint__technique_common;
    local_3ec0 = 0;
    local_3ed8 = ColladaParserAutoGen14Private::_end__rigid_constraint__technique_common;
    uStack_3ed0 = 0;
    local_3ee8 = ColladaParserAutoGen14Private::_preBegin__rigid_constraint__technique_common;
    uStack_3ee0 = 0;
    local_3ef8 = ColladaParserAutoGen14Private::_preEnd__rigid_constraint__technique_common;
    uStack_3ef0 = 0;
    local_3f08 = ColladaParserAutoGen14Private::_freeAttributes__rigid_constraint__technique_common;
    uStack_3f00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3ea8,0x85b7a0,0,0x875580,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b7d0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3ea8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3ea8._88_8_;
    pmVar2->validateEndFunction = local_3ea8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3ea8._72_8_;
    pmVar2->validateBeginFunction = local_3ea8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3ea8._56_8_;
    pmVar2->endFunction = local_3ea8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3ea8._40_8_;
    pmVar2->textDataFunction = local_3ea8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3ea8._24_8_;
    pmVar2->beginFunction = local_3ea8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3ea8._8_8_;
    local_3f78 = ColladaParserAutoGen14Private::_begin__enabled;
    local_3f70 = 0;
    local_3f88 = ColladaParserAutoGen14Private::_data__enabled;
    local_3f80 = 0;
    local_3f98 = ColladaParserAutoGen14Private::_end__enabled;
    uStack_3f90 = 0;
    local_3fa8 = ColladaParserAutoGen14Private::_preBegin__enabled;
    uStack_3fa0 = 0;
    local_3fb8 = ColladaParserAutoGen14Private::_preEnd__enabled;
    uStack_3fb0 = 0;
    local_3fc8 = ColladaParserAutoGen14Private::_freeAttributes__enabled;
    uStack_3fc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_3f68,0x85b7f0,0,0x8755e0,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b820);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_3f68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_3f68._88_8_;
    pmVar2->validateEndFunction = local_3f68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_3f68._72_8_;
    pmVar2->validateBeginFunction = local_3f68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_3f68._56_8_;
    pmVar2->endFunction = local_3f68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_3f68._40_8_;
    pmVar2->textDataFunction = local_3f68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_3f68._24_8_;
    pmVar2->beginFunction = local_3f68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_3f68._8_8_;
    local_4038 = ColladaParserAutoGen14Private::_begin__interpenetrate;
    local_4030 = 0;
    local_4048 = ColladaParserAutoGen14Private::_data__interpenetrate;
    local_4040 = 0;
    local_4058 = ColladaParserAutoGen14Private::_end__interpenetrate;
    uStack_4050 = 0;
    local_4068 = ColladaParserAutoGen14Private::_preBegin__interpenetrate;
    uStack_4060 = 0;
    local_4078 = ColladaParserAutoGen14Private::_preEnd__interpenetrate;
    uStack_4070 = 0;
    local_4088 = ColladaParserAutoGen14Private::_freeAttributes__interpenetrate;
    uStack_4080 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_4028,0x85b840,0,0x875900,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b870);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_4028.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4028._88_8_;
    pmVar2->validateEndFunction = local_4028.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4028._72_8_;
    pmVar2->validateBeginFunction = local_4028.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4028._56_8_;
    pmVar2->endFunction = local_4028.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4028._40_8_;
    pmVar2->textDataFunction = local_4028.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4028._24_8_;
    pmVar2->beginFunction = local_4028.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4028._8_8_;
    local_40f8 = ColladaParserAutoGen14Private::_begin__limits;
    local_40f0 = 0;
    local_4108 = ColladaParserAutoGen14Private::_data__limits;
    local_4100 = 0;
    local_4118 = ColladaParserAutoGen14Private::_end__limits;
    uStack_4110 = 0;
    local_4128 = ColladaParserAutoGen14Private::_preBegin__limits;
    uStack_4120 = 0;
    local_4138 = ColladaParserAutoGen14Private::_preEnd__limits;
    uStack_4130 = 0;
    local_4148 = ColladaParserAutoGen14Private::_freeAttributes__limits;
    uStack_4140 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_40e8,0x85b890,0,0x875c20,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b8c0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_40e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_40e8._88_8_;
    pmVar2->validateEndFunction = local_40e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_40e8._72_8_;
    pmVar2->validateBeginFunction = local_40e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_40e8._56_8_;
    pmVar2->endFunction = local_40e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_40e8._40_8_;
    pmVar2->textDataFunction = local_40e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_40e8._24_8_;
    pmVar2->beginFunction = local_40e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_40e8._8_8_;
    local_41b8 = ColladaParserAutoGen14Private::_begin__spring;
    local_41b0 = 0;
    local_41c8 = ColladaParserAutoGen14Private::_data__spring;
    local_41c0 = 0;
    local_41d8 = ColladaParserAutoGen14Private::_end__spring;
    uStack_41d0 = 0;
    local_41e8 = ColladaParserAutoGen14Private::_preBegin__spring;
    uStack_41e0 = 0;
    local_41f8 = ColladaParserAutoGen14Private::_preEnd__spring;
    uStack_41f0 = 0;
    local_4208 = ColladaParserAutoGen14Private::_freeAttributes__spring;
    uStack_4200 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_41a8,0x85b8e0,0,0x8760c0,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b910);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_41a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_41a8._88_8_;
    pmVar2->validateEndFunction = local_41a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_41a8._72_8_;
    pmVar2->validateBeginFunction = local_41a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_41a8._56_8_;
    pmVar2->endFunction = local_41a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_41a8._40_8_;
    pmVar2->textDataFunction = local_41a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_41a8._24_8_;
    pmVar2->beginFunction = local_41a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_41a8._8_8_;
    local_4278 = ColladaParserAutoGen14Private::_begin__limits__linear;
    local_4270 = 0;
    local_4288 = ColladaParserAutoGen14Private::_data__limits__linear;
    local_4280 = 0;
    local_4298 = ColladaParserAutoGen14Private::_end__limits__linear;
    uStack_4290 = 0;
    local_42a8 = ColladaParserAutoGen14Private::_preBegin__limits__linear;
    uStack_42a0 = 0;
    local_42b8 = ColladaParserAutoGen14Private::_preEnd__limits__linear;
    uStack_42b0 = 0;
    local_42c8 = ColladaParserAutoGen14Private::_freeAttributes__limits__linear;
    uStack_42c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_4268,0x85b930,0,0x876060,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b960);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_4268.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4268._88_8_;
    pmVar2->validateEndFunction = local_4268.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4268._72_8_;
    pmVar2->validateBeginFunction = local_4268.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4268._56_8_;
    pmVar2->endFunction = local_4268.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4268._40_8_;
    pmVar2->textDataFunction = local_4268.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4268._24_8_;
    pmVar2->beginFunction = local_4268.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4268._8_8_;
    local_4338 = ColladaParserAutoGen14Private::_begin__swing_cone_and_twist;
    local_4330 = 0;
    local_4348 = ColladaParserAutoGen14Private::_data__swing_cone_and_twist;
    local_4340 = 0;
    local_4358 = ColladaParserAutoGen14Private::_end__swing_cone_and_twist;
    uStack_4350 = 0;
    local_4368 = ColladaParserAutoGen14Private::_preBegin__swing_cone_and_twist;
    uStack_4360 = 0;
    local_4378 = ColladaParserAutoGen14Private::_preEnd__swing_cone_and_twist;
    uStack_4370 = 0;
    local_4388 = ColladaParserAutoGen14Private::_freeAttributes__swing_cone_and_twist;
    uStack_4380 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_4328,0x85b980,0,0x875c80,0,(ElementValidateEndFunctionPtr)pcVar3,0x85b9b0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_4328.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4328._88_8_;
    pmVar2->validateEndFunction = local_4328.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4328._72_8_;
    pmVar2->validateBeginFunction = local_4328.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4328._56_8_;
    pmVar2->endFunction = local_4328.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4328._40_8_;
    pmVar2->textDataFunction = local_4328.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4328._24_8_;
    pmVar2->beginFunction = local_4328.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4328._8_8_;
    local_43f8 = ColladaParserAutoGen14Private::_begin__max;
    local_43f0 = 0;
    local_4408 = ColladaParserAutoGen14Private::_data__max;
    local_4400 = 0;
    local_4418 = ColladaParserAutoGen14Private::_end__max;
    uStack_4410 = 0;
    local_4428 = ColladaParserAutoGen14Private::_preBegin__max;
    uStack_4420 = 0;
    local_4438 = ColladaParserAutoGen14Private::_preEnd__max;
    uStack_4430 = 0;
    local_4448 = ColladaParserAutoGen14Private::_freeAttributes__max;
    uStack_4440 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_43e8,0x85b9d0,0,0x875ea0,0,(ElementValidateEndFunctionPtr)pcVar3,0x85ba00);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_43e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_43e8._88_8_;
    pmVar2->validateEndFunction = local_43e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_43e8._72_8_;
    pmVar2->validateBeginFunction = local_43e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_43e8._56_8_;
    pmVar2->endFunction = local_43e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_43e8._40_8_;
    pmVar2->textDataFunction = local_43e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_43e8._24_8_;
    pmVar2->beginFunction = local_43e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_43e8._8_8_;
    local_44b8 = ColladaParserAutoGen14Private::_begin__min;
    local_44b0 = 0;
    local_44c8 = ColladaParserAutoGen14Private::_data__min;
    local_44c0 = 0;
    local_44d8 = ColladaParserAutoGen14Private::_end__min;
    uStack_44d0 = 0;
    local_44e8 = ColladaParserAutoGen14Private::_preBegin__min;
    uStack_44e0 = 0;
    local_44f8 = ColladaParserAutoGen14Private::_preEnd__min;
    uStack_44f0 = 0;
    local_4508 = ColladaParserAutoGen14Private::_freeAttributes__min;
    uStack_4500 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_44a8,0x85ba20,0,0x875ce0,0,(ElementValidateEndFunctionPtr)pcVar3,0x85ba50);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_44a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_44a8._88_8_;
    pmVar2->validateEndFunction = local_44a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_44a8._72_8_;
    pmVar2->validateBeginFunction = local_44a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_44a8._56_8_;
    pmVar2->endFunction = local_44a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_44a8._40_8_;
    pmVar2->textDataFunction = local_44a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_44a8._24_8_;
    pmVar2->beginFunction = local_44a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_44a8._8_8_;
    local_4578 = ColladaParserAutoGen14Private::_begin__max;
    local_4570 = 0;
    local_4588 = ColladaParserAutoGen14Private::_data__max;
    local_4580 = 0;
    local_4598 = ColladaParserAutoGen14Private::_end__max;
    uStack_4590 = 0;
    local_45a8 = ColladaParserAutoGen14Private::_preBegin__max;
    uStack_45a0 = 0;
    local_45b8 = ColladaParserAutoGen14Private::_preEnd__max;
    uStack_45b0 = 0;
    local_45c8 = ColladaParserAutoGen14Private::_freeAttributes__max;
    uStack_45c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_4568,0x85b9d0,0,0x875ea0,0,0x875ef0,0x85ba00);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pcVar3 = ColladaParserAutoGen14Private::_preBegin__min;
    pmVar2->freeAttributesFunction = local_4568.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4568._88_8_;
    pmVar2->validateEndFunction = local_4568.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4568._72_8_;
    pmVar2->validateBeginFunction = local_4568.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4568._56_8_;
    pmVar2->endFunction = local_4568.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4568._40_8_;
    pmVar2->textDataFunction = local_4568.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4568._24_8_;
    pmVar2->beginFunction = local_4568.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4568._8_8_;
    local_4638 = ColladaParserAutoGen14Private::_begin__min;
    local_4630 = 0;
    local_4648 = ColladaParserAutoGen14Private::_data__min;
    local_4640 = 0;
    local_4658 = ColladaParserAutoGen14Private::_end__min;
    uStack_4650 = 0;
    local_4668 = ColladaParserAutoGen14Private::_preBegin__min;
    uStack_4660 = 0;
    local_4678 = ColladaParserAutoGen14Private::_preEnd__min;
    uStack_4670 = 0;
    local_4688 = ColladaParserAutoGen14Private::_freeAttributes__min;
    uStack_4680 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_4628,0x85ba20,0,0x875ce0,0,0x875d30,0x85ba50);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_4628.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4628._88_8_;
    pmVar2->validateEndFunction = local_4628.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4628._72_8_;
    pmVar2->validateBeginFunction = local_4628.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4628._56_8_;
    pmVar2->endFunction = local_4628.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4628._40_8_;
    pmVar2->textDataFunction = local_4628.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4628._24_8_;
    pmVar2->beginFunction = local_4628.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4628._8_8_;
    local_46f8 = ColladaParserAutoGen14Private::_begin__angular;
    local_46f0 = 0;
    local_4708 = ColladaParserAutoGen14Private::_data__angular;
    local_4700 = 0;
    local_4718 = ColladaParserAutoGen14Private::_end__angular;
    uStack_4710 = 0;
    local_4728 = ColladaParserAutoGen14Private::_preBegin__angular;
    uStack_4720 = 0;
    local_4738 = ColladaParserAutoGen14Private::_preEnd__angular;
    uStack_4730 = 0;
    local_4748 = ColladaParserAutoGen14Private::_freeAttributes__angular;
    uStack_4740 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_46e8,0x85ba70,0,0x876120,0,(ElementValidateEndFunctionPtr)pcVar3,0x85baa0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_46e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_46e8._88_8_;
    pmVar2->validateEndFunction = local_46e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_46e8._72_8_;
    pmVar2->validateBeginFunction = local_46e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_46e8._56_8_;
    pmVar2->endFunction = local_46e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_46e8._40_8_;
    pmVar2->textDataFunction = local_46e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_46e8._24_8_;
    pmVar2->beginFunction = local_46e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_46e8._8_8_;
    local_47b8 = ColladaParserAutoGen14Private::_begin__spring__linear;
    local_47b0 = 0;
    local_47c8 = ColladaParserAutoGen14Private::_data__spring__linear;
    local_47c0 = 0;
    local_47d8 = ColladaParserAutoGen14Private::_end__spring__linear;
    uStack_47d0 = 0;
    local_47e8 = ColladaParserAutoGen14Private::_preBegin__spring__linear;
    uStack_47e0 = 0;
    local_47f8 = ColladaParserAutoGen14Private::_preEnd__spring__linear;
    uStack_47f0 = 0;
    local_4808 = ColladaParserAutoGen14Private::_freeAttributes__spring__linear;
    uStack_4800 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_47a8,0x85bac0,0,0x876ae0,0,(ElementValidateEndFunctionPtr)pcVar3,0x85baf0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_47a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_47a8._88_8_;
    pmVar2->validateEndFunction = local_47a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_47a8._72_8_;
    pmVar2->validateBeginFunction = local_47a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_47a8._56_8_;
    pmVar2->endFunction = local_47a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_47a8._40_8_;
    pmVar2->textDataFunction = local_47a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_47a8._24_8_;
    pmVar2->beginFunction = local_47a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_47a8._8_8_;
    local_4878 = ColladaParserAutoGen14Private::_begin__damping;
    local_4870 = 0;
    local_4888 = ColladaParserAutoGen14Private::_data__damping;
    local_4880 = 0;
    local_4898 = ColladaParserAutoGen14Private::_end__damping;
    uStack_4890 = 0;
    local_48a8 = ColladaParserAutoGen14Private::_preBegin__damping;
    uStack_48a0 = 0;
    local_48b8 = ColladaParserAutoGen14Private::_preEnd__damping;
    uStack_48b0 = 0;
    local_48c8 = ColladaParserAutoGen14Private::_freeAttributes__damping;
    uStack_48c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_4868,0x85bb10,0,0x8764a0,0,(ElementValidateEndFunctionPtr)pcVar3,0x85bb40);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_4868.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4868._88_8_;
    pmVar2->validateEndFunction = local_4868.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4868._72_8_;
    pmVar2->validateBeginFunction = local_4868.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4868._56_8_;
    pmVar2->endFunction = local_4868.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4868._40_8_;
    pmVar2->textDataFunction = local_4868.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4868._24_8_;
    pmVar2->beginFunction = local_4868.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4868._8_8_;
    local_4938 = ColladaParserAutoGen14Private::_begin__stiffness;
    local_4930 = 0;
    local_4948 = ColladaParserAutoGen14Private::_data__stiffness;
    local_4940 = 0;
    local_4958 = ColladaParserAutoGen14Private::_end__stiffness;
    uStack_4950 = 0;
    local_4968 = ColladaParserAutoGen14Private::_preBegin__stiffness;
    uStack_4960 = 0;
    local_4978 = ColladaParserAutoGen14Private::_preEnd__stiffness;
    uStack_4970 = 0;
    local_4988 = ColladaParserAutoGen14Private::_freeAttributes__stiffness;
    uStack_4980 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_4928,0x85bb60,0,0x876180,0,(ElementValidateEndFunctionPtr)pcVar3,0x85bb90);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_4928.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4928._88_8_;
    pmVar2->validateEndFunction = local_4928.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4928._72_8_;
    pmVar2->validateBeginFunction = local_4928.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4928._56_8_;
    pmVar2->endFunction = local_4928.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4928._40_8_;
    pmVar2->textDataFunction = local_4928.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4928._24_8_;
    pmVar2->beginFunction = local_4928.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4928._8_8_;
    local_49f8 = ColladaParserAutoGen14Private::_begin__target_value;
    local_49f0 = 0;
    local_4a08 = ColladaParserAutoGen14Private::_data__target_value;
    local_4a00 = 0;
    local_4a18 = ColladaParserAutoGen14Private::_end__target_value;
    uStack_4a10 = 0;
    local_4a28 = ColladaParserAutoGen14Private::_preBegin__target_value;
    uStack_4a20 = 0;
    local_4a38 = ColladaParserAutoGen14Private::_preEnd__target_value;
    uStack_4a30 = 0;
    local_4a48 = ColladaParserAutoGen14Private::_freeAttributes__target_value;
    uStack_4a40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_49e8,0x85bbb0,0,0x8767c0,0,(ElementValidateEndFunctionPtr)pcVar3,0x85bbe0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_49e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_49e8._88_8_;
    pmVar2->validateEndFunction = local_49e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_49e8._72_8_;
    pmVar2->validateBeginFunction = local_49e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_49e8._56_8_;
    pmVar2->endFunction = local_49e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_49e8._40_8_;
    pmVar2->textDataFunction = local_49e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_49e8._24_8_;
    pmVar2->beginFunction = local_49e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_49e8._8_8_;
    local_4ab8 = ColladaParserAutoGen14Private::_begin__damping;
    local_4ab0 = 0;
    local_4ac8 = ColladaParserAutoGen14Private::_data__damping;
    local_4ac0 = 0;
    local_4ad8 = ColladaParserAutoGen14Private::_end__damping;
    uStack_4ad0 = 0;
    local_4ae8 = ColladaParserAutoGen14Private::_preBegin__damping;
    uStack_4ae0 = 0;
    local_4af8 = ColladaParserAutoGen14Private::_preEnd__damping;
    uStack_4af0 = 0;
    local_4b08 = ColladaParserAutoGen14Private::_freeAttributes__damping;
    uStack_4b00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_4aa8,0x85bb10,0,0x8764a0,0,0x8765b0,0x85bb40);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_4aa8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4aa8._88_8_;
    pmVar2->validateEndFunction = local_4aa8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4aa8._72_8_;
    pmVar2->validateBeginFunction = local_4aa8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4aa8._56_8_;
    pmVar2->endFunction = local_4aa8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4aa8._40_8_;
    pmVar2->textDataFunction = local_4aa8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4aa8._24_8_;
    pmVar2->beginFunction = local_4aa8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4aa8._8_8_;
    local_4b78 = ColladaParserAutoGen14Private::_begin__stiffness;
    local_4b70 = 0;
    local_4b88 = ColladaParserAutoGen14Private::_data__stiffness;
    local_4b80 = 0;
    local_4b98 = ColladaParserAutoGen14Private::_end__stiffness;
    uStack_4b90 = 0;
    local_4ba8 = ColladaParserAutoGen14Private::_preBegin__stiffness;
    uStack_4ba0 = 0;
    local_4bb8 = ColladaParserAutoGen14Private::_preEnd__stiffness;
    uStack_4bb0 = 0;
    local_4bc8 = ColladaParserAutoGen14Private::_freeAttributes__stiffness;
    uStack_4bc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_4b68,0x85bb60,0,0x876180,0,0x876290,0x85bb90);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    pmVar2->freeAttributesFunction = local_4b68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4b68._88_8_;
    pmVar2->validateEndFunction = local_4b68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4b68._72_8_;
    pmVar2->validateBeginFunction = local_4b68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4b68._56_8_;
    pmVar2->endFunction = local_4b68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4b68._40_8_;
    pmVar2->textDataFunction = local_4b68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4b68._24_8_;
    pmVar2->beginFunction = local_4b68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4b68._8_8_;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_4c28,0x85bbb0,0,0x8767c0,0,0x876ac0,0x85bbe0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,(key_type *)__k);
    memcpy(pmVar2,&local_4c28,0x60);
    createFunctionMap__library_physics_models__allChildren::mapFilled = true;
  }
  return &createFunctionMap__library_physics_models__allChildren::functionMap;
}

Assistant:

const ColladaParserAutoGen14Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__library_physics_models__allChildren() {
static ColladaParserAutoGen14Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__COLLADA, &ColladaParserAutoGen14Private::_data__COLLADA, &ColladaParserAutoGen14Private::_end__COLLADA, &ColladaParserAutoGen14Private::_preBegin__COLLADA, &ColladaParserAutoGen14Private::_preEnd__COLLADA, &ColladaParserAutoGen14Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_MODELS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_models, &ColladaParserAutoGen14Private::_data__library_physics_models, &ColladaParserAutoGen14Private::_end__library_physics_models, &ColladaParserAutoGen14Private::_preBegin__library_physics_models, &ColladaParserAutoGen14Private::_preEnd__library_physics_models, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_models);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__asset, &ColladaParserAutoGen14Private::_data__asset, &ColladaParserAutoGen14Private::_end__asset, &ColladaParserAutoGen14Private::_preBegin__asset, &ColladaParserAutoGen14Private::_preEnd__asset, &ColladaParserAutoGen14Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__extra, &ColladaParserAutoGen14Private::_data__extra, &ColladaParserAutoGen14Private::_end__extra, &ColladaParserAutoGen14Private::_preBegin__extra, &ColladaParserAutoGen14Private::_preEnd__extra, &ColladaParserAutoGen14Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_PHYSICS_MODEL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__physics_model, &ColladaParserAutoGen14Private::_data__physics_model, &ColladaParserAutoGen14Private::_end__physics_model, &ColladaParserAutoGen14Private::_preBegin__physics_model, &ColladaParserAutoGen14Private::_preEnd__physics_model, &ColladaParserAutoGen14Private::_freeAttributes__physics_model);
functionMap[HASH_ELEMENT_CONTRIBUTOR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__contributor, &ColladaParserAutoGen14Private::_data__contributor, &ColladaParserAutoGen14Private::_end__contributor, &ColladaParserAutoGen14Private::_preBegin__contributor, &ColladaParserAutoGen14Private::_preEnd__contributor, &ColladaParserAutoGen14Private::_freeAttributes__contributor);
functionMap[HASH_ELEMENT_CREATED] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__created, &ColladaParserAutoGen14Private::_data__created, &ColladaParserAutoGen14Private::_end__created, &ColladaParserAutoGen14Private::_preBegin__created, &ColladaParserAutoGen14Private::_preEnd__created, &ColladaParserAutoGen14Private::_freeAttributes__created);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__keywords, &ColladaParserAutoGen14Private::_data__keywords, &ColladaParserAutoGen14Private::_end__keywords, &ColladaParserAutoGen14Private::_preBegin__keywords, &ColladaParserAutoGen14Private::_preEnd__keywords, &ColladaParserAutoGen14Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__modified, &ColladaParserAutoGen14Private::_data__modified, &ColladaParserAutoGen14Private::_end__modified, &ColladaParserAutoGen14Private::_preBegin__modified, &ColladaParserAutoGen14Private::_preEnd__modified, &ColladaParserAutoGen14Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__revision, &ColladaParserAutoGen14Private::_data__revision, &ColladaParserAutoGen14Private::_end__revision, &ColladaParserAutoGen14Private::_preBegin__revision, &ColladaParserAutoGen14Private::_preEnd__revision, &ColladaParserAutoGen14Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__subject, &ColladaParserAutoGen14Private::_data__subject, &ColladaParserAutoGen14Private::_end__subject, &ColladaParserAutoGen14Private::_preBegin__subject, &ColladaParserAutoGen14Private::_preEnd__subject, &ColladaParserAutoGen14Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__title, &ColladaParserAutoGen14Private::_data__title, &ColladaParserAutoGen14Private::_end__title, &ColladaParserAutoGen14Private::_preBegin__title, &ColladaParserAutoGen14Private::_preEnd__title, &ColladaParserAutoGen14Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__unit, &ColladaParserAutoGen14Private::_data__unit, &ColladaParserAutoGen14Private::_end__unit, &ColladaParserAutoGen14Private::_preBegin__unit, &ColladaParserAutoGen14Private::_preEnd__unit, &ColladaParserAutoGen14Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__up_axis, &ColladaParserAutoGen14Private::_data__up_axis, &ColladaParserAutoGen14Private::_end__up_axis, &ColladaParserAutoGen14Private::_preBegin__up_axis, &ColladaParserAutoGen14Private::_preEnd__up_axis, &ColladaParserAutoGen14Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_AUTHOR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__author, &ColladaParserAutoGen14Private::_data__author, &ColladaParserAutoGen14Private::_end__author, &ColladaParserAutoGen14Private::_preBegin__author, &ColladaParserAutoGen14Private::_preEnd__author, &ColladaParserAutoGen14Private::_freeAttributes__author);
functionMap[HASH_ELEMENT_AUTHORING_TOOL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__authoring_tool, &ColladaParserAutoGen14Private::_data__authoring_tool, &ColladaParserAutoGen14Private::_end__authoring_tool, &ColladaParserAutoGen14Private::_preBegin__authoring_tool, &ColladaParserAutoGen14Private::_preEnd__authoring_tool, &ColladaParserAutoGen14Private::_freeAttributes__authoring_tool);
functionMap[HASH_ELEMENT_COMMENTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__comments, &ColladaParserAutoGen14Private::_data__comments, &ColladaParserAutoGen14Private::_end__comments, &ColladaParserAutoGen14Private::_preBegin__comments, &ColladaParserAutoGen14Private::_preEnd__comments, &ColladaParserAutoGen14Private::_freeAttributes__comments);
functionMap[HASH_ELEMENT_COPYRIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__copyright, &ColladaParserAutoGen14Private::_data__copyright, &ColladaParserAutoGen14Private::_end__copyright, &ColladaParserAutoGen14Private::_preBegin__copyright, &ColladaParserAutoGen14Private::_preEnd__copyright, &ColladaParserAutoGen14Private::_freeAttributes__copyright);
functionMap[HASH_ELEMENT_SOURCE_DATA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__source_data, &ColladaParserAutoGen14Private::_data__source_data, &ColladaParserAutoGen14Private::_end__source_data, &ColladaParserAutoGen14Private::_preBegin__source_data, &ColladaParserAutoGen14Private::_preEnd__source_data, &ColladaParserAutoGen14Private::_freeAttributes__source_data);
functionMap[HASH_ELEMENT_TECHNIQUE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__technique, &ColladaParserAutoGen14Private::_data__technique, &ColladaParserAutoGen14Private::_end__technique, &ColladaParserAutoGen14Private::_preBegin__technique, &ColladaParserAutoGen14Private::_preEnd__technique, &ColladaParserAutoGen14Private::_freeAttributes__technique);
functionMap[HASH_ELEMENT_INSTANCE_PHYSICS_MODEL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_physics_model, &ColladaParserAutoGen14Private::_data__instance_physics_model, &ColladaParserAutoGen14Private::_end__instance_physics_model, &ColladaParserAutoGen14Private::_preBegin__instance_physics_model, &ColladaParserAutoGen14Private::_preEnd__instance_physics_model, &ColladaParserAutoGen14Private::_freeAttributes__instance_physics_model);
functionMap[HASH_ELEMENT_RIGID_BODY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body, &ColladaParserAutoGen14Private::_data__rigid_body, &ColladaParserAutoGen14Private::_end__rigid_body, &ColladaParserAutoGen14Private::_preBegin__rigid_body, &ColladaParserAutoGen14Private::_preEnd__rigid_body, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body);
functionMap[HASH_ELEMENT_RIGID_CONSTRAINT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_constraint, &ColladaParserAutoGen14Private::_data__rigid_constraint, &ColladaParserAutoGen14Private::_end__rigid_constraint, &ColladaParserAutoGen14Private::_preBegin__rigid_constraint, &ColladaParserAutoGen14Private::_preEnd__rigid_constraint, &ColladaParserAutoGen14Private::_freeAttributes__rigid_constraint);
functionMap[HASH_ELEMENT_INSTANCE_FORCE_FIELD] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_force_field, &ColladaParserAutoGen14Private::_data__instance_force_field, &ColladaParserAutoGen14Private::_end__instance_force_field, &ColladaParserAutoGen14Private::_preBegin__instance_force_field, &ColladaParserAutoGen14Private::_preEnd__instance_force_field, &ColladaParserAutoGen14Private::_freeAttributes__instance_force_field);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body, &ColladaParserAutoGen14Private::_data__instance_rigid_body, &ColladaParserAutoGen14Private::_end__instance_rigid_body, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_CONSTRAINT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_constraint, &ColladaParserAutoGen14Private::_data__instance_rigid_constraint, &ColladaParserAutoGen14Private::_end__instance_rigid_constraint, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_constraint, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_constraint, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_constraint);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common);
functionMap[HASH_ELEMENT_ANGULAR_VELOCITY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__angular_velocity, &ColladaParserAutoGen14Private::_data__angular_velocity, &ColladaParserAutoGen14Private::_end__angular_velocity, &ColladaParserAutoGen14Private::_preBegin__angular_velocity, &ColladaParserAutoGen14Private::_preEnd__angular_velocity, &ColladaParserAutoGen14Private::_freeAttributes__angular_velocity);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__DYNAMIC] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common__dynamic);
functionMap[HASH_ELEMENT_INERTIA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__inertia, &ColladaParserAutoGen14Private::_data__inertia, &ColladaParserAutoGen14Private::_end__inertia, &ColladaParserAutoGen14Private::_preBegin__inertia, &ColladaParserAutoGen14Private::_preEnd__inertia, &ColladaParserAutoGen14Private::_freeAttributes__inertia);
functionMap[HASH_ELEMENT_INSTANCE_PHYSICS_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_physics_material, &ColladaParserAutoGen14Private::_data__instance_physics_material, &ColladaParserAutoGen14Private::_end__instance_physics_material, &ColladaParserAutoGen14Private::_preBegin__instance_physics_material, &ColladaParserAutoGen14Private::_preEnd__instance_physics_material, &ColladaParserAutoGen14Private::_freeAttributes__instance_physics_material);
functionMap[HASH_ELEMENT_MASS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__mass, &ColladaParserAutoGen14Private::_data__mass, &ColladaParserAutoGen14Private::_end__mass, &ColladaParserAutoGen14Private::_preBegin__mass, &ColladaParserAutoGen14Private::_preEnd__mass, &ColladaParserAutoGen14Private::_freeAttributes__mass);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__MASS_FRAME] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common__mass_frame);
functionMap[HASH_ELEMENT_PHYSICS_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__physics_material, &ColladaParserAutoGen14Private::_data__physics_material, &ColladaParserAutoGen14Private::_end__physics_material, &ColladaParserAutoGen14Private::_preBegin__physics_material, &ColladaParserAutoGen14Private::_preEnd__physics_material, &ColladaParserAutoGen14Private::_freeAttributes__physics_material);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__SHAPE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common__shape);
functionMap[HASH_ELEMENT_VELOCITY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__velocity, &ColladaParserAutoGen14Private::_data__velocity, &ColladaParserAutoGen14Private::_end__velocity, &ColladaParserAutoGen14Private::_preBegin__velocity, &ColladaParserAutoGen14Private::_preEnd__velocity, &ColladaParserAutoGen14Private::_freeAttributes__velocity);
functionMap[HASH_ELEMENT_ROTATE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rotate, &ColladaParserAutoGen14Private::_data__rotate, &ColladaParserAutoGen14Private::_end__rotate, &ColladaParserAutoGen14Private::_preBegin__rotate, &ColladaParserAutoGen14Private::_preEnd__rotate, &ColladaParserAutoGen14Private::_freeAttributes__rotate);
functionMap[HASH_ELEMENT_TRANSLATE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__translate, &ColladaParserAutoGen14Private::_data__translate, &ColladaParserAutoGen14Private::_end__translate, &ColladaParserAutoGen14Private::_preBegin__translate, &ColladaParserAutoGen14Private::_preEnd__translate, &ColladaParserAutoGen14Private::_freeAttributes__translate);
functionMap[HASH_ELEMENT_PHYSICS_MATERIAL__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__physics_material__technique_common, &ColladaParserAutoGen14Private::_data__physics_material__technique_common, &ColladaParserAutoGen14Private::_end__physics_material__technique_common, &ColladaParserAutoGen14Private::_preBegin__physics_material__technique_common, &ColladaParserAutoGen14Private::_preEnd__physics_material__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__physics_material__technique_common);
functionMap[HASH_ELEMENT_DYNAMIC_FRICTION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__dynamic_friction, &ColladaParserAutoGen14Private::_data__dynamic_friction, &ColladaParserAutoGen14Private::_end__dynamic_friction, &ColladaParserAutoGen14Private::_preBegin__dynamic_friction, &ColladaParserAutoGen14Private::_preEnd__dynamic_friction, &ColladaParserAutoGen14Private::_freeAttributes__dynamic_friction);
functionMap[HASH_ELEMENT_RESTITUTION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__restitution, &ColladaParserAutoGen14Private::_data__restitution, &ColladaParserAutoGen14Private::_end__restitution, &ColladaParserAutoGen14Private::_preBegin__restitution, &ColladaParserAutoGen14Private::_preEnd__restitution, &ColladaParserAutoGen14Private::_freeAttributes__restitution);
functionMap[HASH_ELEMENT_STATIC_FRICTION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__static_friction, &ColladaParserAutoGen14Private::_data__static_friction, &ColladaParserAutoGen14Private::_end__static_friction, &ColladaParserAutoGen14Private::_preBegin__static_friction, &ColladaParserAutoGen14Private::_preEnd__static_friction, &ColladaParserAutoGen14Private::_freeAttributes__static_friction);
functionMap[HASH_ELEMENT_BOX] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__box, &ColladaParserAutoGen14Private::_data__box, &ColladaParserAutoGen14Private::_end__box, &ColladaParserAutoGen14Private::_preBegin__box, &ColladaParserAutoGen14Private::_preEnd__box, &ColladaParserAutoGen14Private::_freeAttributes__box);
functionMap[HASH_ELEMENT_CAPSULE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__capsule, &ColladaParserAutoGen14Private::_data__capsule, &ColladaParserAutoGen14Private::_end__capsule, &ColladaParserAutoGen14Private::_preBegin__capsule, &ColladaParserAutoGen14Private::_preEnd__capsule, &ColladaParserAutoGen14Private::_freeAttributes__capsule);
functionMap[HASH_ELEMENT_CYLINDER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__cylinder, &ColladaParserAutoGen14Private::_data__cylinder, &ColladaParserAutoGen14Private::_end__cylinder, &ColladaParserAutoGen14Private::_preBegin__cylinder, &ColladaParserAutoGen14Private::_preEnd__cylinder, &ColladaParserAutoGen14Private::_freeAttributes__cylinder);
functionMap[HASH_ELEMENT_DENSITY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__density, &ColladaParserAutoGen14Private::_data__density, &ColladaParserAutoGen14Private::_end__density, &ColladaParserAutoGen14Private::_preBegin__density, &ColladaParserAutoGen14Private::_preEnd__density, &ColladaParserAutoGen14Private::_freeAttributes__density);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__SHAPE__HOLLOW] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common__shape__hollow);
functionMap[HASH_ELEMENT_INSTANCE_GEOMETRY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_geometry, &ColladaParserAutoGen14Private::_data__instance_geometry, &ColladaParserAutoGen14Private::_end__instance_geometry, &ColladaParserAutoGen14Private::_preBegin__instance_geometry, &ColladaParserAutoGen14Private::_preEnd__instance_geometry, &ColladaParserAutoGen14Private::_freeAttributes__instance_geometry);
functionMap[HASH_ELEMENT_MASS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__mass, &ColladaParserAutoGen14Private::_data__mass, &ColladaParserAutoGen14Private::_end__mass, &ColladaParserAutoGen14Private::_preBegin__mass, &ColladaParserAutoGen14Private::_preEnd__mass, &ColladaParserAutoGen14Private::_freeAttributes__mass);
functionMap[HASH_ELEMENT_PLANE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__plane, &ColladaParserAutoGen14Private::_data__plane, &ColladaParserAutoGen14Private::_end__plane, &ColladaParserAutoGen14Private::_preBegin__plane, &ColladaParserAutoGen14Private::_preEnd__plane, &ColladaParserAutoGen14Private::_freeAttributes__plane);
functionMap[HASH_ELEMENT_SPHERE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__sphere, &ColladaParserAutoGen14Private::_data__sphere, &ColladaParserAutoGen14Private::_end__sphere, &ColladaParserAutoGen14Private::_preBegin__sphere, &ColladaParserAutoGen14Private::_preEnd__sphere, &ColladaParserAutoGen14Private::_freeAttributes__sphere);
functionMap[HASH_ELEMENT_TAPERED_CAPSULE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__tapered_capsule, &ColladaParserAutoGen14Private::_data__tapered_capsule, &ColladaParserAutoGen14Private::_end__tapered_capsule, &ColladaParserAutoGen14Private::_preBegin__tapered_capsule, &ColladaParserAutoGen14Private::_preEnd__tapered_capsule, &ColladaParserAutoGen14Private::_freeAttributes__tapered_capsule);
functionMap[HASH_ELEMENT_TAPERED_CYLINDER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__tapered_cylinder, &ColladaParserAutoGen14Private::_data__tapered_cylinder, &ColladaParserAutoGen14Private::_end__tapered_cylinder, &ColladaParserAutoGen14Private::_preBegin__tapered_cylinder, &ColladaParserAutoGen14Private::_preEnd__tapered_cylinder, &ColladaParserAutoGen14Private::_freeAttributes__tapered_cylinder);
functionMap[HASH_ELEMENT_HALF_EXTENTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__half_extents, &ColladaParserAutoGen14Private::_data__half_extents, &ColladaParserAutoGen14Private::_end__half_extents, &ColladaParserAutoGen14Private::_preBegin__half_extents, &ColladaParserAutoGen14Private::_preEnd__half_extents, &ColladaParserAutoGen14Private::_freeAttributes__half_extents);
functionMap[HASH_ELEMENT_HEIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__height, &ColladaParserAutoGen14Private::_data__height, &ColladaParserAutoGen14Private::_end__height, &ColladaParserAutoGen14Private::_preBegin__height, &ColladaParserAutoGen14Private::_preEnd__height, &ColladaParserAutoGen14Private::_freeAttributes__height);
functionMap[HASH_ELEMENT_RADIUS____FLOAT2] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius____float2, &ColladaParserAutoGen14Private::_data__radius____float2, &ColladaParserAutoGen14Private::_end__radius____float2, &ColladaParserAutoGen14Private::_preBegin__radius____float2, &ColladaParserAutoGen14Private::_preEnd__radius____float2, &ColladaParserAutoGen14Private::_freeAttributes__radius____float2);
functionMap[HASH_ELEMENT_HEIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__height, &ColladaParserAutoGen14Private::_data__height, &ColladaParserAutoGen14Private::_end__height, &ColladaParserAutoGen14Private::_preBegin__height, &ColladaParserAutoGen14Private::_preEnd__height, &ColladaParserAutoGen14Private::_freeAttributes__height);
functionMap[HASH_ELEMENT_RADIUS____FLOAT2] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius____float2, &ColladaParserAutoGen14Private::_data__radius____float2, &ColladaParserAutoGen14Private::_end__radius____float2, &ColladaParserAutoGen14Private::_preBegin__radius____float2, &ColladaParserAutoGen14Private::_preEnd__radius____float2, &ColladaParserAutoGen14Private::_freeAttributes__radius____float2);
functionMap[HASH_ELEMENT_BIND_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__bind_material, &ColladaParserAutoGen14Private::_data__bind_material, &ColladaParserAutoGen14Private::_end__bind_material, &ColladaParserAutoGen14Private::_preBegin__bind_material, &ColladaParserAutoGen14Private::_preEnd__bind_material, &ColladaParserAutoGen14Private::_freeAttributes__bind_material);
functionMap[HASH_ELEMENT_PARAM] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__param, &ColladaParserAutoGen14Private::_data__param, &ColladaParserAutoGen14Private::_end__param, &ColladaParserAutoGen14Private::_preBegin__param, &ColladaParserAutoGen14Private::_preEnd__param, &ColladaParserAutoGen14Private::_freeAttributes__param);
functionMap[HASH_ELEMENT_BIND_MATERIAL__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__bind_material__technique_common, &ColladaParserAutoGen14Private::_data__bind_material__technique_common, &ColladaParserAutoGen14Private::_end__bind_material__technique_common, &ColladaParserAutoGen14Private::_preBegin__bind_material__technique_common, &ColladaParserAutoGen14Private::_preEnd__bind_material__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__bind_material__technique_common);
functionMap[HASH_ELEMENT_INSTANCE_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_material, &ColladaParserAutoGen14Private::_data__instance_material, &ColladaParserAutoGen14Private::_end__instance_material, &ColladaParserAutoGen14Private::_preBegin__instance_material, &ColladaParserAutoGen14Private::_preEnd__instance_material, &ColladaParserAutoGen14Private::_freeAttributes__instance_material);
functionMap[HASH_ELEMENT_INSTANCE_MATERIAL__BIND] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_material__bind, &ColladaParserAutoGen14Private::_data__instance_material__bind, &ColladaParserAutoGen14Private::_end__instance_material__bind, &ColladaParserAutoGen14Private::_preBegin__instance_material__bind, &ColladaParserAutoGen14Private::_preEnd__instance_material__bind, &ColladaParserAutoGen14Private::_freeAttributes__instance_material__bind);
functionMap[HASH_ELEMENT_BIND_VERTEX_INPUT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__bind_vertex_input, &ColladaParserAutoGen14Private::_data__bind_vertex_input, &ColladaParserAutoGen14Private::_end__bind_vertex_input, &ColladaParserAutoGen14Private::_preBegin__bind_vertex_input, &ColladaParserAutoGen14Private::_preEnd__bind_vertex_input, &ColladaParserAutoGen14Private::_freeAttributes__bind_vertex_input);
functionMap[HASH_ELEMENT_EQUATION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__equation, &ColladaParserAutoGen14Private::_data__equation, &ColladaParserAutoGen14Private::_end__equation, &ColladaParserAutoGen14Private::_preBegin__equation, &ColladaParserAutoGen14Private::_preEnd__equation, &ColladaParserAutoGen14Private::_freeAttributes__equation);
functionMap[HASH_ELEMENT_RADIUS____FLOAT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius____float, &ColladaParserAutoGen14Private::_data__radius____float, &ColladaParserAutoGen14Private::_end__radius____float, &ColladaParserAutoGen14Private::_preBegin__radius____float, &ColladaParserAutoGen14Private::_preEnd__radius____float, &ColladaParserAutoGen14Private::_freeAttributes__radius____float);
functionMap[HASH_ELEMENT_HEIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__height, &ColladaParserAutoGen14Private::_data__height, &ColladaParserAutoGen14Private::_end__height, &ColladaParserAutoGen14Private::_preBegin__height, &ColladaParserAutoGen14Private::_preEnd__height, &ColladaParserAutoGen14Private::_freeAttributes__height);
functionMap[HASH_ELEMENT_RADIUS1] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius1, &ColladaParserAutoGen14Private::_data__radius1, &ColladaParserAutoGen14Private::_end__radius1, &ColladaParserAutoGen14Private::_preBegin__radius1, &ColladaParserAutoGen14Private::_preEnd__radius1, &ColladaParserAutoGen14Private::_freeAttributes__radius1);
functionMap[HASH_ELEMENT_RADIUS2] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius2, &ColladaParserAutoGen14Private::_data__radius2, &ColladaParserAutoGen14Private::_end__radius2, &ColladaParserAutoGen14Private::_preBegin__radius2, &ColladaParserAutoGen14Private::_preEnd__radius2, &ColladaParserAutoGen14Private::_freeAttributes__radius2);
functionMap[HASH_ELEMENT_HEIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__height, &ColladaParserAutoGen14Private::_data__height, &ColladaParserAutoGen14Private::_end__height, &ColladaParserAutoGen14Private::_preBegin__height, &ColladaParserAutoGen14Private::_preEnd__height, &ColladaParserAutoGen14Private::_freeAttributes__height);
functionMap[HASH_ELEMENT_RADIUS1] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius1, &ColladaParserAutoGen14Private::_data__radius1, &ColladaParserAutoGen14Private::_end__radius1, &ColladaParserAutoGen14Private::_preBegin__radius1, &ColladaParserAutoGen14Private::_preEnd__radius1, &ColladaParserAutoGen14Private::_freeAttributes__radius1);
functionMap[HASH_ELEMENT_RADIUS2] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius2, &ColladaParserAutoGen14Private::_data__radius2, &ColladaParserAutoGen14Private::_end__radius2, &ColladaParserAutoGen14Private::_preBegin__radius2, &ColladaParserAutoGen14Private::_preEnd__radius2, &ColladaParserAutoGen14Private::_freeAttributes__radius2);
functionMap[HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body__technique_common, &ColladaParserAutoGen14Private::_data__rigid_body__technique_common, &ColladaParserAutoGen14Private::_end__rigid_body__technique_common, &ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common, &ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common);
functionMap[HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__DYNAMIC] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_data__rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_end__rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__dynamic);
functionMap[HASH_ELEMENT_INERTIA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__inertia, &ColladaParserAutoGen14Private::_data__inertia, &ColladaParserAutoGen14Private::_end__inertia, &ColladaParserAutoGen14Private::_preBegin__inertia, &ColladaParserAutoGen14Private::_preEnd__inertia, &ColladaParserAutoGen14Private::_freeAttributes__inertia);
functionMap[HASH_ELEMENT_MASS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__mass, &ColladaParserAutoGen14Private::_data__mass, &ColladaParserAutoGen14Private::_end__mass, &ColladaParserAutoGen14Private::_preBegin__mass, &ColladaParserAutoGen14Private::_preEnd__mass, &ColladaParserAutoGen14Private::_freeAttributes__mass);
functionMap[HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__MASS_FRAME] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_data__rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_end__rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__mass_frame);
functionMap[HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__SHAPE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_data__rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_end__rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__shape);
functionMap[HASH_ELEMENT_DENSITY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__density, &ColladaParserAutoGen14Private::_data__density, &ColladaParserAutoGen14Private::_end__density, &ColladaParserAutoGen14Private::_preBegin__density, &ColladaParserAutoGen14Private::_preEnd__density, &ColladaParserAutoGen14Private::_freeAttributes__density);
functionMap[HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__SHAPE__HOLLOW] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_data__rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_end__rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__shape__hollow);
functionMap[HASH_ELEMENT_MASS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__mass, &ColladaParserAutoGen14Private::_data__mass, &ColladaParserAutoGen14Private::_end__mass, &ColladaParserAutoGen14Private::_preBegin__mass, &ColladaParserAutoGen14Private::_preEnd__mass, &ColladaParserAutoGen14Private::_freeAttributes__mass);
functionMap[HASH_ELEMENT_ATTACHMENT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__attachment, &ColladaParserAutoGen14Private::_data__attachment, &ColladaParserAutoGen14Private::_end__attachment, &ColladaParserAutoGen14Private::_preBegin__attachment, &ColladaParserAutoGen14Private::_preEnd__attachment, &ColladaParserAutoGen14Private::_freeAttributes__attachment);
functionMap[HASH_ELEMENT_REF_ATTACHMENT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__ref_attachment, &ColladaParserAutoGen14Private::_data__ref_attachment, &ColladaParserAutoGen14Private::_end__ref_attachment, &ColladaParserAutoGen14Private::_preBegin__ref_attachment, &ColladaParserAutoGen14Private::_preEnd__ref_attachment, &ColladaParserAutoGen14Private::_freeAttributes__ref_attachment);
functionMap[HASH_ELEMENT_RIGID_CONSTRAINT__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_constraint__technique_common, &ColladaParserAutoGen14Private::_data__rigid_constraint__technique_common, &ColladaParserAutoGen14Private::_end__rigid_constraint__technique_common, &ColladaParserAutoGen14Private::_preBegin__rigid_constraint__technique_common, &ColladaParserAutoGen14Private::_preEnd__rigid_constraint__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__rigid_constraint__technique_common);
functionMap[HASH_ELEMENT_ENABLED] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__enabled, &ColladaParserAutoGen14Private::_data__enabled, &ColladaParserAutoGen14Private::_end__enabled, &ColladaParserAutoGen14Private::_preBegin__enabled, &ColladaParserAutoGen14Private::_preEnd__enabled, &ColladaParserAutoGen14Private::_freeAttributes__enabled);
functionMap[HASH_ELEMENT_INTERPENETRATE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__interpenetrate, &ColladaParserAutoGen14Private::_data__interpenetrate, &ColladaParserAutoGen14Private::_end__interpenetrate, &ColladaParserAutoGen14Private::_preBegin__interpenetrate, &ColladaParserAutoGen14Private::_preEnd__interpenetrate, &ColladaParserAutoGen14Private::_freeAttributes__interpenetrate);
functionMap[HASH_ELEMENT_LIMITS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__limits, &ColladaParserAutoGen14Private::_data__limits, &ColladaParserAutoGen14Private::_end__limits, &ColladaParserAutoGen14Private::_preBegin__limits, &ColladaParserAutoGen14Private::_preEnd__limits, &ColladaParserAutoGen14Private::_freeAttributes__limits);
functionMap[HASH_ELEMENT_SPRING] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__spring, &ColladaParserAutoGen14Private::_data__spring, &ColladaParserAutoGen14Private::_end__spring, &ColladaParserAutoGen14Private::_preBegin__spring, &ColladaParserAutoGen14Private::_preEnd__spring, &ColladaParserAutoGen14Private::_freeAttributes__spring);
functionMap[HASH_ELEMENT_LIMITS__LINEAR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__limits__linear, &ColladaParserAutoGen14Private::_data__limits__linear, &ColladaParserAutoGen14Private::_end__limits__linear, &ColladaParserAutoGen14Private::_preBegin__limits__linear, &ColladaParserAutoGen14Private::_preEnd__limits__linear, &ColladaParserAutoGen14Private::_freeAttributes__limits__linear);
functionMap[HASH_ELEMENT_SWING_CONE_AND_TWIST] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__swing_cone_and_twist, &ColladaParserAutoGen14Private::_data__swing_cone_and_twist, &ColladaParserAutoGen14Private::_end__swing_cone_and_twist, &ColladaParserAutoGen14Private::_preBegin__swing_cone_and_twist, &ColladaParserAutoGen14Private::_preEnd__swing_cone_and_twist, &ColladaParserAutoGen14Private::_freeAttributes__swing_cone_and_twist);
functionMap[HASH_ELEMENT_MAX] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__max, &ColladaParserAutoGen14Private::_data__max, &ColladaParserAutoGen14Private::_end__max, &ColladaParserAutoGen14Private::_preBegin__max, &ColladaParserAutoGen14Private::_preEnd__max, &ColladaParserAutoGen14Private::_freeAttributes__max);
functionMap[HASH_ELEMENT_MIN] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__min, &ColladaParserAutoGen14Private::_data__min, &ColladaParserAutoGen14Private::_end__min, &ColladaParserAutoGen14Private::_preBegin__min, &ColladaParserAutoGen14Private::_preEnd__min, &ColladaParserAutoGen14Private::_freeAttributes__min);
functionMap[HASH_ELEMENT_MAX] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__max, &ColladaParserAutoGen14Private::_data__max, &ColladaParserAutoGen14Private::_end__max, &ColladaParserAutoGen14Private::_preBegin__max, &ColladaParserAutoGen14Private::_preEnd__max, &ColladaParserAutoGen14Private::_freeAttributes__max);
functionMap[HASH_ELEMENT_MIN] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__min, &ColladaParserAutoGen14Private::_data__min, &ColladaParserAutoGen14Private::_end__min, &ColladaParserAutoGen14Private::_preBegin__min, &ColladaParserAutoGen14Private::_preEnd__min, &ColladaParserAutoGen14Private::_freeAttributes__min);
functionMap[HASH_ELEMENT_ANGULAR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__angular, &ColladaParserAutoGen14Private::_data__angular, &ColladaParserAutoGen14Private::_end__angular, &ColladaParserAutoGen14Private::_preBegin__angular, &ColladaParserAutoGen14Private::_preEnd__angular, &ColladaParserAutoGen14Private::_freeAttributes__angular);
functionMap[HASH_ELEMENT_SPRING__LINEAR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__spring__linear, &ColladaParserAutoGen14Private::_data__spring__linear, &ColladaParserAutoGen14Private::_end__spring__linear, &ColladaParserAutoGen14Private::_preBegin__spring__linear, &ColladaParserAutoGen14Private::_preEnd__spring__linear, &ColladaParserAutoGen14Private::_freeAttributes__spring__linear);
functionMap[HASH_ELEMENT_DAMPING] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__damping, &ColladaParserAutoGen14Private::_data__damping, &ColladaParserAutoGen14Private::_end__damping, &ColladaParserAutoGen14Private::_preBegin__damping, &ColladaParserAutoGen14Private::_preEnd__damping, &ColladaParserAutoGen14Private::_freeAttributes__damping);
functionMap[HASH_ELEMENT_STIFFNESS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__stiffness, &ColladaParserAutoGen14Private::_data__stiffness, &ColladaParserAutoGen14Private::_end__stiffness, &ColladaParserAutoGen14Private::_preBegin__stiffness, &ColladaParserAutoGen14Private::_preEnd__stiffness, &ColladaParserAutoGen14Private::_freeAttributes__stiffness);
functionMap[HASH_ELEMENT_TARGET_VALUE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__target_value, &ColladaParserAutoGen14Private::_data__target_value, &ColladaParserAutoGen14Private::_end__target_value, &ColladaParserAutoGen14Private::_preBegin__target_value, &ColladaParserAutoGen14Private::_preEnd__target_value, &ColladaParserAutoGen14Private::_freeAttributes__target_value);
functionMap[HASH_ELEMENT_DAMPING] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__damping, &ColladaParserAutoGen14Private::_data__damping, &ColladaParserAutoGen14Private::_end__damping, &ColladaParserAutoGen14Private::_preBegin__damping, &ColladaParserAutoGen14Private::_preEnd__damping, &ColladaParserAutoGen14Private::_freeAttributes__damping);
functionMap[HASH_ELEMENT_STIFFNESS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__stiffness, &ColladaParserAutoGen14Private::_data__stiffness, &ColladaParserAutoGen14Private::_end__stiffness, &ColladaParserAutoGen14Private::_preBegin__stiffness, &ColladaParserAutoGen14Private::_preEnd__stiffness, &ColladaParserAutoGen14Private::_freeAttributes__stiffness);
functionMap[HASH_ELEMENT_TARGET_VALUE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__target_value, &ColladaParserAutoGen14Private::_data__target_value, &ColladaParserAutoGen14Private::_end__target_value, &ColladaParserAutoGen14Private::_preBegin__target_value, &ColladaParserAutoGen14Private::_preEnd__target_value, &ColladaParserAutoGen14Private::_freeAttributes__target_value);
mapFilled = true;
}
return functionMap;
}